

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  Primitive PVar1;
  int iVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [12];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  byte bVar53;
  byte bVar54;
  ulong uVar55;
  byte bVar56;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar78 [16];
  ulong uVar57;
  byte bVar58;
  byte bVar59;
  uint uVar60;
  ulong uVar61;
  byte bVar62;
  byte bVar63;
  long lVar64;
  bool bVar65;
  bool bVar66;
  ulong uVar67;
  uint uVar68;
  uint uVar142;
  uint uVar143;
  uint uVar145;
  uint uVar146;
  uint uVar147;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  uint uVar144;
  uint uVar148;
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  float pp;
  float fVar149;
  undefined4 uVar150;
  undefined1 auVar160 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar151;
  undefined1 auVar159 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar207;
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar236 [16];
  float fVar238;
  float fVar239;
  float fVar240;
  undefined1 auVar237 [32];
  undefined1 auVar241 [64];
  float t;
  float fVar242;
  float fVar247;
  undefined1 auVar243 [16];
  float fVar245;
  float fVar246;
  undefined1 auVar244 [64];
  float s;
  undefined1 auVar248 [32];
  undefined1 auVar249 [64];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vint<16> mask;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  float local_bd0;
  RTCFilterFunctionNArguments local_970;
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_890 [16];
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  float local_860;
  float fStack_85c;
  float fStack_858;
  float fStack_854;
  undefined1 local_850 [16];
  undefined1 local_840 [16];
  undefined1 local_830 [16];
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [64];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte local_1a0 [32];
  undefined1 auStack_180 [32];
  float local_160 [2];
  int local_158 [74];
  undefined1 auVar124 [32];
  undefined1 auVar136 [64];
  undefined1 auVar139 [64];
  
  PVar1 = prim[1];
  uVar55 = (ulong)(byte)PVar1;
  fVar234 = *(float *)(prim + uVar55 * 0x19 + 0x12);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar73 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar74 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + uVar55 * 0x19 + 6));
  fVar207 = fVar234 * auVar74._0_4_;
  fVar149 = fVar234 * auVar73._0_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar55 * 4 + 6);
  auVar84 = vpmovsxbd_avx2(auVar12);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar55 * 5 + 6);
  auVar83 = vpmovsxbd_avx2(auVar13);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar55 * 6 + 6);
  auVar85 = vpmovsxbd_avx2(auVar69);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar55 * 0xb + 6);
  auVar86 = vpmovsxbd_avx2(auVar71);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6);
  auVar87 = vpmovsxbd_avx2(auVar78);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + (uint)(byte)PVar1 * 0xc + uVar55 + 6);
  auVar88 = vpmovsxbd_avx2(auVar70);
  auVar88 = vcvtdq2ps_avx(auVar88);
  uVar61 = (ulong)(uint)((int)(uVar55 * 9) * 2);
  auVar236._8_8_ = 0;
  auVar236._0_8_ = *(ulong *)(prim + uVar61 + 6);
  auVar89 = vpmovsxbd_avx2(auVar236);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar61 + uVar55 + 6);
  auVar92 = vpmovsxbd_avx2(auVar72);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar90 = vcvtdq2ps_avx(auVar92);
  uVar67 = (ulong)(uint)((int)(uVar55 * 5) << 2);
  auVar243._8_8_ = 0;
  auVar243._0_8_ = *(ulong *)(prim + uVar67 + 6);
  auVar81 = vpmovsxbd_avx2(auVar243);
  auVar91 = vcvtdq2ps_avx(auVar81);
  auVar99._4_4_ = fVar149;
  auVar99._0_4_ = fVar149;
  auVar99._8_4_ = fVar149;
  auVar99._12_4_ = fVar149;
  auVar99._16_4_ = fVar149;
  auVar99._20_4_ = fVar149;
  auVar99._24_4_ = fVar149;
  auVar99._28_4_ = fVar149;
  auVar101._8_4_ = 1;
  auVar101._0_8_ = 0x100000001;
  auVar101._12_4_ = 1;
  auVar101._16_4_ = 1;
  auVar101._20_4_ = 1;
  auVar101._24_4_ = 1;
  auVar101._28_4_ = 1;
  auVar93 = ZEXT1632(CONCAT412(fVar234 * auVar73._12_4_,
                               CONCAT48(fVar234 * auVar73._8_4_,
                                        CONCAT44(fVar234 * auVar73._4_4_,fVar149))));
  auVar82 = vpermps_avx2(auVar101,auVar93);
  auVar79 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar80 = vpermps_avx512vl(auVar79,auVar93);
  fVar149 = auVar80._0_4_;
  fVar228 = auVar80._4_4_;
  auVar93._4_4_ = fVar228 * auVar85._4_4_;
  auVar93._0_4_ = fVar149 * auVar85._0_4_;
  fVar229 = auVar80._8_4_;
  auVar93._8_4_ = fVar229 * auVar85._8_4_;
  fVar230 = auVar80._12_4_;
  auVar93._12_4_ = fVar230 * auVar85._12_4_;
  fVar231 = auVar80._16_4_;
  auVar93._16_4_ = fVar231 * auVar85._16_4_;
  fVar232 = auVar80._20_4_;
  auVar93._20_4_ = fVar232 * auVar85._20_4_;
  fVar233 = auVar80._24_4_;
  auVar93._24_4_ = fVar233 * auVar85._24_4_;
  auVar93._28_4_ = auVar92._28_4_;
  auVar92._4_4_ = auVar88._4_4_ * fVar228;
  auVar92._0_4_ = auVar88._0_4_ * fVar149;
  auVar92._8_4_ = auVar88._8_4_ * fVar229;
  auVar92._12_4_ = auVar88._12_4_ * fVar230;
  auVar92._16_4_ = auVar88._16_4_ * fVar231;
  auVar92._20_4_ = auVar88._20_4_ * fVar232;
  auVar92._24_4_ = auVar88._24_4_ * fVar233;
  auVar92._28_4_ = auVar81._28_4_;
  auVar81._4_4_ = auVar91._4_4_ * fVar228;
  auVar81._0_4_ = auVar91._0_4_ * fVar149;
  auVar81._8_4_ = auVar91._8_4_ * fVar229;
  auVar81._12_4_ = auVar91._12_4_ * fVar230;
  auVar81._16_4_ = auVar91._16_4_ * fVar231;
  auVar81._20_4_ = auVar91._20_4_ * fVar232;
  auVar81._24_4_ = auVar91._24_4_ * fVar233;
  auVar81._28_4_ = auVar80._28_4_;
  auVar12 = vfmadd231ps_fma(auVar93,auVar82,auVar83);
  auVar13 = vfmadd231ps_fma(auVar92,auVar82,auVar87);
  auVar69 = vfmadd231ps_fma(auVar81,auVar90,auVar82);
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar99,auVar84);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar99,auVar86);
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar89,auVar99);
  auVar100._4_4_ = fVar207;
  auVar100._0_4_ = fVar207;
  auVar100._8_4_ = fVar207;
  auVar100._12_4_ = fVar207;
  auVar100._16_4_ = fVar207;
  auVar100._20_4_ = fVar207;
  auVar100._24_4_ = fVar207;
  auVar100._28_4_ = fVar207;
  auVar81 = ZEXT1632(CONCAT412(fVar234 * auVar74._12_4_,
                               CONCAT48(fVar234 * auVar74._8_4_,
                                        CONCAT44(fVar234 * auVar74._4_4_,fVar207))));
  auVar92 = vpermps_avx2(auVar101,auVar81);
  auVar81 = vpermps_avx512vl(auVar79,auVar81);
  auVar82 = vmulps_avx512vl(auVar81,auVar85);
  auVar95._0_4_ = auVar81._0_4_ * auVar88._0_4_;
  auVar95._4_4_ = auVar81._4_4_ * auVar88._4_4_;
  auVar95._8_4_ = auVar81._8_4_ * auVar88._8_4_;
  auVar95._12_4_ = auVar81._12_4_ * auVar88._12_4_;
  auVar95._16_4_ = auVar81._16_4_ * auVar88._16_4_;
  auVar95._20_4_ = auVar81._20_4_ * auVar88._20_4_;
  auVar95._24_4_ = auVar81._24_4_ * auVar88._24_4_;
  auVar95._28_4_ = 0;
  auVar88._4_4_ = auVar81._4_4_ * auVar91._4_4_;
  auVar88._0_4_ = auVar81._0_4_ * auVar91._0_4_;
  auVar88._8_4_ = auVar81._8_4_ * auVar91._8_4_;
  auVar88._12_4_ = auVar81._12_4_ * auVar91._12_4_;
  auVar88._16_4_ = auVar81._16_4_ * auVar91._16_4_;
  auVar88._20_4_ = auVar81._20_4_ * auVar91._20_4_;
  auVar88._24_4_ = auVar81._24_4_ * auVar91._24_4_;
  auVar88._28_4_ = auVar85._28_4_;
  auVar83 = vfmadd231ps_avx512vl(auVar82,auVar92,auVar83);
  auVar71 = vfmadd231ps_fma(auVar95,auVar92,auVar87);
  auVar78 = vfmadd231ps_fma(auVar88,auVar92,auVar90);
  auVar83 = vfmadd231ps_avx512vl(auVar83,auVar100,auVar84);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar100,auVar86);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar100,auVar89);
  auVar84 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar253 = ZEXT3264(auVar84);
  vandps_avx512vl(ZEXT1632(auVar12),auVar84);
  auVar97._8_4_ = 0x219392ef;
  auVar97._0_8_ = 0x219392ef219392ef;
  auVar97._12_4_ = 0x219392ef;
  auVar97._16_4_ = 0x219392ef;
  auVar97._20_4_ = 0x219392ef;
  auVar97._24_4_ = 0x219392ef;
  auVar97._28_4_ = 0x219392ef;
  uVar61 = vcmpps_avx512vl(auVar84,auVar97,1);
  bVar66 = (bool)((byte)uVar61 & 1);
  auVar82._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar12._0_4_;
  bVar66 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar12._4_4_;
  bVar66 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar12._8_4_;
  bVar66 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar12._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar61 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar13),auVar84);
  uVar61 = vcmpps_avx512vl(auVar82,auVar97,1);
  bVar66 = (bool)((byte)uVar61 & 1);
  auVar79._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar13._0_4_;
  bVar66 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar13._4_4_;
  bVar66 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar13._8_4_;
  bVar66 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar13._12_4_;
  auVar79._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * 0x219392ef;
  auVar79._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * 0x219392ef;
  auVar79._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * 0x219392ef;
  auVar79._28_4_ = (uint)(byte)(uVar61 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar69),auVar84);
  uVar61 = vcmpps_avx512vl(auVar79,auVar97,1);
  bVar66 = (bool)((byte)uVar61 & 1);
  auVar84._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar69._0_4_;
  bVar66 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar69._4_4_;
  bVar66 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar69._8_4_;
  bVar66 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar69._12_4_;
  auVar84._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * 0x219392ef;
  auVar84._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * 0x219392ef;
  auVar84._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * 0x219392ef;
  auVar84._28_4_ = (uint)(byte)(uVar61 >> 7) * 0x219392ef;
  auVar85 = vrcp14ps_avx512vl(auVar82);
  auVar98._8_4_ = 0x3f800000;
  auVar98._0_8_ = &DAT_3f8000003f800000;
  auVar98._12_4_ = 0x3f800000;
  auVar98._16_4_ = 0x3f800000;
  auVar98._20_4_ = 0x3f800000;
  auVar98._24_4_ = 0x3f800000;
  auVar98._28_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar82,auVar85,auVar98);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar79);
  auVar13 = vfnmadd213ps_fma(auVar79,auVar85,auVar98);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar84);
  auVar69 = vfnmadd213ps_fma(auVar84,auVar85,auVar98);
  auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar85,auVar85);
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar55 * 7 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar85 = vsubps_avx512vl(auVar84,auVar83);
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar55 * 9 + 6));
  auVar89._4_4_ = auVar12._4_4_ * auVar85._4_4_;
  auVar89._0_4_ = auVar12._0_4_ * auVar85._0_4_;
  auVar89._8_4_ = auVar12._8_4_ * auVar85._8_4_;
  auVar89._12_4_ = auVar12._12_4_ * auVar85._12_4_;
  auVar89._16_4_ = auVar85._16_4_ * 0.0;
  auVar89._20_4_ = auVar85._20_4_ * 0.0;
  auVar89._24_4_ = auVar85._24_4_ * 0.0;
  auVar89._28_4_ = auVar85._28_4_;
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx512vl(auVar84,auVar83);
  auVar96._0_4_ = auVar12._0_4_ * auVar84._0_4_;
  auVar96._4_4_ = auVar12._4_4_ * auVar84._4_4_;
  auVar96._8_4_ = auVar12._8_4_ * auVar84._8_4_;
  auVar96._12_4_ = auVar12._12_4_ * auVar84._12_4_;
  auVar96._16_4_ = auVar84._16_4_ * 0.0;
  auVar96._20_4_ = auVar84._20_4_ * 0.0;
  auVar96._24_4_ = auVar84._24_4_ * 0.0;
  auVar96._28_4_ = 0;
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar1 * 0x10 + 6));
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar1 * 0x10 + uVar55 * -2 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar71));
  auVar90._4_4_ = auVar13._4_4_ * auVar84._4_4_;
  auVar90._0_4_ = auVar13._0_4_ * auVar84._0_4_;
  auVar90._8_4_ = auVar13._8_4_ * auVar84._8_4_;
  auVar90._12_4_ = auVar13._12_4_ * auVar84._12_4_;
  auVar90._16_4_ = auVar84._16_4_ * 0.0;
  auVar90._20_4_ = auVar84._20_4_ * 0.0;
  auVar90._24_4_ = auVar84._24_4_ * 0.0;
  auVar90._28_4_ = auVar84._28_4_;
  auVar84 = vcvtdq2ps_avx(auVar83);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar71));
  auVar94._0_4_ = auVar13._0_4_ * auVar84._0_4_;
  auVar94._4_4_ = auVar13._4_4_ * auVar84._4_4_;
  auVar94._8_4_ = auVar13._8_4_ * auVar84._8_4_;
  auVar94._12_4_ = auVar13._12_4_ * auVar84._12_4_;
  auVar94._16_4_ = auVar84._16_4_ * 0.0;
  auVar94._20_4_ = auVar84._20_4_ * 0.0;
  auVar94._24_4_ = auVar84._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar67 + uVar55 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar78));
  auVar91._4_4_ = auVar84._4_4_ * auVar69._4_4_;
  auVar91._0_4_ = auVar84._0_4_ * auVar69._0_4_;
  auVar91._8_4_ = auVar84._8_4_ * auVar69._8_4_;
  auVar91._12_4_ = auVar84._12_4_ * auVar69._12_4_;
  auVar91._16_4_ = auVar84._16_4_ * 0.0;
  auVar91._20_4_ = auVar84._20_4_ * 0.0;
  auVar91._24_4_ = auVar84._24_4_ * 0.0;
  auVar91._28_4_ = auVar84._28_4_;
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar55 * 0x17 + 6));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,ZEXT1632(auVar78));
  auVar80._0_4_ = auVar69._0_4_ * auVar84._0_4_;
  auVar80._4_4_ = auVar69._4_4_ * auVar84._4_4_;
  auVar80._8_4_ = auVar69._8_4_ * auVar84._8_4_;
  auVar80._12_4_ = auVar69._12_4_ * auVar84._12_4_;
  auVar80._16_4_ = auVar84._16_4_ * 0.0;
  auVar80._20_4_ = auVar84._20_4_ * 0.0;
  auVar80._24_4_ = auVar84._24_4_ * 0.0;
  auVar80._28_4_ = 0;
  auVar84 = vpminsd_avx2(auVar89,auVar96);
  auVar83 = vpminsd_avx2(auVar90,auVar94);
  auVar84 = vmaxps_avx(auVar84,auVar83);
  auVar83 = vpminsd_avx2(auVar91,auVar80);
  uVar150 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar85._4_4_ = uVar150;
  auVar85._0_4_ = uVar150;
  auVar85._8_4_ = uVar150;
  auVar85._12_4_ = uVar150;
  auVar85._16_4_ = uVar150;
  auVar85._20_4_ = uVar150;
  auVar85._24_4_ = uVar150;
  auVar85._28_4_ = uVar150;
  auVar83 = vmaxps_avx512vl(auVar83,auVar85);
  auVar84 = vmaxps_avx(auVar84,auVar83);
  auVar83._8_4_ = 0x3f7ffffa;
  auVar83._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar83._12_4_ = 0x3f7ffffa;
  auVar83._16_4_ = 0x3f7ffffa;
  auVar83._20_4_ = 0x3f7ffffa;
  auVar83._24_4_ = 0x3f7ffffa;
  auVar83._28_4_ = 0x3f7ffffa;
  local_600 = vmulps_avx512vl(auVar84,auVar83);
  auVar84 = vpmaxsd_avx2(auVar89,auVar96);
  auVar83 = vpmaxsd_avx2(auVar90,auVar94);
  auVar84 = vminps_avx(auVar84,auVar83);
  auVar83 = vpmaxsd_avx2(auVar91,auVar80);
  uVar150 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar86._4_4_ = uVar150;
  auVar86._0_4_ = uVar150;
  auVar86._8_4_ = uVar150;
  auVar86._12_4_ = uVar150;
  auVar86._16_4_ = uVar150;
  auVar86._20_4_ = uVar150;
  auVar86._24_4_ = uVar150;
  auVar86._28_4_ = uVar150;
  auVar83 = vminps_avx512vl(auVar83,auVar86);
  auVar84 = vminps_avx(auVar84,auVar83);
  auVar87._8_4_ = 0x3f800003;
  auVar87._0_8_ = 0x3f8000033f800003;
  auVar87._12_4_ = 0x3f800003;
  auVar87._16_4_ = 0x3f800003;
  auVar87._20_4_ = 0x3f800003;
  auVar87._24_4_ = 0x3f800003;
  auVar87._28_4_ = 0x3f800003;
  auVar84 = vmulps_avx512vl(auVar84,auVar87);
  auVar83 = vpbroadcastd_avx512vl();
  uVar16 = vpcmpgtd_avx512vl(auVar83,_DAT_0205a920);
  uVar14 = vcmpps_avx512vl(local_600,auVar84,2);
  bVar65 = (byte)((byte)uVar14 & (byte)uVar16) == 0;
  bVar66 = !bVar65;
  if (bVar65) {
    return bVar66;
  }
  uVar61 = (ulong)(byte)((byte)uVar14 & (byte)uVar16);
  auVar172 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar172);
LAB_01db84ba:
  lVar64 = 0;
  for (uVar55 = uVar61; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
    lVar64 = lVar64 + 1;
  }
  uVar60 = *(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[uVar60].ptr;
  uVar55 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar64 * 4 + 6));
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar64 = *(long *)&pGVar3[1].time_range.upper;
  auVar12 = *(undefined1 (*) [16])(lVar64 + (long)p_Var4 * uVar55);
  auVar13 = *(undefined1 (*) [16])(lVar64 + (uVar55 + 1) * (long)p_Var4);
  uVar61 = uVar61 - 1 & uVar61;
  if (uVar61 != 0) {
    uVar57 = uVar61 - 1 & uVar61;
    for (uVar67 = uVar61; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    }
    if (uVar57 != 0) {
      for (; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar69 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar71 = vinsertps_avx(auVar69,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar84 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  auVar83 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar69 = vunpcklps_avx512vl(auVar84._0_16_,auVar83._0_16_);
  fVar234 = *(float *)(ray + k * 4 + 0x180);
  auVar77._4_4_ = fVar234;
  auVar77._0_4_ = fVar234;
  auVar77._8_4_ = fVar234;
  auVar77._12_4_ = fVar234;
  local_680._16_4_ = fVar234;
  local_680._0_16_ = auVar77;
  local_680._20_4_ = fVar234;
  local_680._24_4_ = fVar234;
  local_680._28_4_ = fVar234;
  auVar252 = ZEXT3264(local_680);
  local_930 = vinsertps_avx(auVar69,auVar77,0x28);
  auVar244 = ZEXT1664(local_930);
  auVar74._0_4_ = auVar12._0_4_ + auVar13._0_4_;
  auVar74._4_4_ = auVar12._4_4_ + auVar13._4_4_;
  auVar74._8_4_ = auVar12._8_4_ + auVar13._8_4_;
  auVar74._12_4_ = auVar12._12_4_ + auVar13._12_4_;
  auVar73._8_4_ = 0x3f000000;
  auVar73._0_8_ = 0x3f0000003f000000;
  auVar73._12_4_ = 0x3f000000;
  auVar69 = vmulps_avx512vl(auVar74,auVar73);
  auVar69 = vsubps_avx(auVar69,auVar71);
  auVar69 = vdpps_avx(auVar69,local_930,0x7f);
  fVar149 = *(float *)(ray + k * 4 + 0xc0);
  local_940 = vdpps_avx(local_930,local_930,0x7f);
  auVar249 = ZEXT1664(local_940);
  auVar75._4_12_ = ZEXT812(0) << 0x20;
  auVar75._0_4_ = local_940._0_4_;
  auVar70 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar75);
  auVar78 = vfnmadd213ss_fma(auVar70,local_940,ZEXT416(0x40000000));
  local_580 = auVar69._0_4_ * auVar70._0_4_ * auVar78._0_4_;
  auVar76._4_4_ = local_580;
  auVar76._0_4_ = local_580;
  auVar76._8_4_ = local_580;
  auVar76._12_4_ = local_580;
  fStack_790 = local_580;
  _local_7a0 = auVar76;
  fStack_78c = local_580;
  fStack_788 = local_580;
  fStack_784 = local_580;
  auVar69 = vfmadd231ps_fma(auVar71,local_930,auVar76);
  auVar69 = vblendps_avx(auVar69,ZEXT816(0) << 0x40,8);
  auVar12 = vsubps_avx(auVar12,auVar69);
  auVar71 = vsubps_avx(*(undefined1 (*) [16])(lVar64 + (uVar55 + 2) * (long)p_Var4),auVar69);
  auVar13 = vsubps_avx(auVar13,auVar69);
  auVar241 = ZEXT1664(auVar13);
  auVar69 = vsubps_avx(*(undefined1 (*) [16])(lVar64 + (uVar55 + 3) * (long)p_Var4),auVar69);
  auVar85 = vbroadcastss_avx512vl(auVar12);
  auVar102._8_4_ = 1;
  auVar102._0_8_ = 0x100000001;
  auVar102._12_4_ = 1;
  auVar102._16_4_ = 1;
  auVar102._20_4_ = 1;
  auVar102._24_4_ = 1;
  auVar102._28_4_ = 1;
  local_8c0 = ZEXT1632(auVar12);
  auVar86 = vpermps_avx512vl(auVar102,local_8c0);
  auVar103._8_4_ = 2;
  auVar103._0_8_ = 0x200000002;
  auVar103._12_4_ = 2;
  auVar103._16_4_ = 2;
  auVar103._20_4_ = 2;
  auVar103._24_4_ = 2;
  auVar103._28_4_ = 2;
  auVar134._0_32_ = vpermps_avx512vl(auVar103,local_8c0);
  auVar104._8_4_ = 3;
  auVar104._0_8_ = 0x300000003;
  auVar104._12_4_ = 3;
  auVar104._16_4_ = 3;
  auVar104._20_4_ = 3;
  auVar104._24_4_ = 3;
  auVar104._28_4_ = 3;
  auVar87 = vpermps_avx512vl(auVar104,local_8c0);
  auVar88 = vbroadcastss_avx512vl(auVar13);
  local_900 = ZEXT1632(auVar13);
  auVar89 = vpermps_avx512vl(auVar102,local_900);
  auVar90 = vpermps_avx512vl(auVar103,local_900);
  auVar91 = vpermps_avx512vl(auVar104,local_900);
  auVar92 = vbroadcastss_avx512vl(auVar71);
  local_8e0 = ZEXT1632(auVar71);
  auVar172._0_32_ = vpermps_avx512vl(auVar102,local_8e0);
  local_5a0 = vpermps_avx2(auVar103,local_8e0);
  local_520 = vpermps_avx2(auVar104,local_8e0);
  local_5c0 = vbroadcastss_avx512vl(auVar69);
  _local_920 = ZEXT1632(auVar69);
  local_5e0 = vpermps_avx512vl(auVar102,_local_920);
  _local_800 = vpermps_avx2(auVar103,_local_920);
  _local_540 = vpermps_avx2(auVar104,_local_920);
  auVar81 = vfmadd231ps_avx512vl(ZEXT432((uint)(fVar234 * fVar234)),auVar83,auVar83);
  local_6a0 = vfmadd231ps_avx512vl(auVar81,auVar84,auVar84);
  uVar150 = local_6a0._0_4_;
  local_560._4_4_ = uVar150;
  local_560._0_4_ = uVar150;
  local_560._8_4_ = uVar150;
  local_560._12_4_ = uVar150;
  local_560._16_4_ = uVar150;
  local_560._20_4_ = uVar150;
  local_560._24_4_ = uVar150;
  local_560._28_4_ = uVar150;
  vandps_avx512vl(local_560,auVar253._0_32_);
  local_870 = ZEXT416((uint)local_580);
  local_580 = fVar149 - local_580;
  fStack_57c = local_580;
  fStack_578 = local_580;
  fStack_574 = local_580;
  fStack_570 = local_580;
  fStack_56c = local_580;
  fStack_568 = local_580;
  fStack_564 = local_580;
  auVar253 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar253);
  iVar2 = 1;
  uVar55 = 0;
  bVar62 = 0;
  auVar253 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar253);
  auVar12 = vsqrtss_avx(local_940,local_940);
  auVar13 = vsqrtss_avx(local_940,local_940);
  local_890 = ZEXT816(0x3f80000000000000);
  auVar218 = ZEXT3264(_local_800);
  auVar81 = auVar253._32_32_;
  do {
    auVar69 = vmovshdup_avx(local_890);
    fVar229 = local_890._0_4_;
    fVar228 = auVar69._0_4_ - fVar229;
    fVar234 = fVar228 * 0.04761905;
    auVar223._4_4_ = fVar229;
    auVar223._0_4_ = fVar229;
    auVar223._8_4_ = fVar229;
    auVar223._12_4_ = fVar229;
    auVar223._16_4_ = fVar229;
    auVar223._20_4_ = fVar229;
    auVar223._24_4_ = fVar229;
    auVar223._28_4_ = fVar229;
    auVar160._4_4_ = fVar228;
    auVar160._0_4_ = fVar228;
    auVar160._8_4_ = fVar228;
    auVar160._12_4_ = fVar228;
    auVar160._16_4_ = fVar228;
    auVar160._20_4_ = fVar228;
    auVar160._24_4_ = fVar228;
    auVar160._28_4_ = fVar228;
    auVar69 = vfmadd231ps_fma(auVar223,auVar160,_DAT_02020f20);
    auVar161._8_4_ = 0x3f800000;
    auVar161._0_8_ = &DAT_3f8000003f800000;
    auVar161._12_4_ = 0x3f800000;
    auVar161._16_4_ = 0x3f800000;
    auVar161._20_4_ = 0x3f800000;
    auVar161._24_4_ = 0x3f800000;
    auVar161._28_4_ = 0x3f800000;
    auVar82 = vsubps_avx(auVar161,ZEXT1632(auVar69));
    fVar228 = auVar69._0_4_;
    fVar229 = auVar69._4_4_;
    fVar230 = auVar69._8_4_;
    fVar231 = auVar69._12_4_;
    fVar232 = auVar82._0_4_;
    fVar233 = auVar82._4_4_;
    fVar207 = auVar82._8_4_;
    fVar238 = auVar82._12_4_;
    fVar235 = auVar82._16_4_;
    fVar151 = auVar82._20_4_;
    fVar239 = auVar82._24_4_;
    auVar111._4_4_ = fVar233 * fVar233 * -fVar229;
    auVar111._0_4_ = fVar232 * fVar232 * -fVar228;
    auVar111._8_4_ = fVar207 * fVar207 * -fVar230;
    auVar111._12_4_ = fVar238 * fVar238 * -fVar231;
    auVar111._16_4_ = fVar235 * fVar235 * -0.0;
    auVar111._20_4_ = fVar151 * fVar151 * -0.0;
    auVar111._24_4_ = fVar239 * fVar239 * -0.0;
    auVar111._28_4_ = 0x80000000;
    auVar253._28_36_ = auVar241._28_36_;
    auVar253._0_28_ =
         ZEXT1628(CONCAT412(fVar231 * fVar231,
                            CONCAT48(fVar230 * fVar230,CONCAT44(fVar229 * fVar229,fVar228 * fVar228)
                                    )));
    fVar242 = fVar228 * 3.0;
    fVar245 = fVar229 * 3.0;
    fVar246 = fVar230 * 3.0;
    fVar247 = fVar231 * 3.0;
    auVar241._28_36_ = auVar244._28_36_;
    auVar241._0_28_ = ZEXT1628(CONCAT412(fVar247,CONCAT48(fVar246,CONCAT44(fVar245,fVar242))));
    auVar187._0_4_ = fVar228 * fVar228 * (fVar242 + -5.0) + 2.0;
    auVar187._4_4_ = fVar229 * fVar229 * (fVar245 + -5.0) + 2.0;
    auVar187._8_4_ = fVar230 * fVar230 * (fVar246 + -5.0) + 2.0;
    auVar187._12_4_ = fVar231 * fVar231 * (fVar247 + -5.0) + 2.0;
    auVar187._16_4_ = 0x40000000;
    auVar187._20_4_ = 0x40000000;
    auVar187._24_4_ = 0x40000000;
    auVar187._28_4_ = 0x40000000;
    auVar140._0_4_ = fVar232 * fVar232;
    auVar140._4_4_ = fVar233 * fVar233;
    auVar140._8_4_ = fVar207 * fVar207;
    auVar140._12_4_ = fVar238 * fVar238;
    auVar140._16_4_ = fVar235 * fVar235;
    auVar140._20_4_ = fVar151 * fVar151;
    auVar140._28_36_ = auVar249._28_36_;
    auVar140._24_4_ = fVar239 * fVar239;
    auVar205._0_4_ = auVar140._0_4_ * (fVar232 * 3.0 + -5.0) + 2.0;
    auVar205._4_4_ = auVar140._4_4_ * (fVar233 * 3.0 + -5.0) + 2.0;
    auVar205._8_4_ = auVar140._8_4_ * (fVar207 * 3.0 + -5.0) + 2.0;
    auVar205._12_4_ = auVar140._12_4_ * (fVar238 * 3.0 + -5.0) + 2.0;
    auVar205._16_4_ = auVar140._16_4_ * (fVar235 * 3.0 + -5.0) + 2.0;
    auVar205._20_4_ = auVar140._20_4_ * (fVar151 * 3.0 + -5.0) + 2.0;
    auVar205._24_4_ = auVar140._24_4_ * (fVar239 * 3.0 + -5.0) + 2.0;
    auVar205._28_4_ = auVar252._28_4_ + -5.0 + 2.0;
    fVar240 = auVar82._28_4_;
    auVar112._4_4_ = fVar229 * fVar229 * -fVar233;
    auVar112._0_4_ = fVar228 * fVar228 * -fVar232;
    auVar112._8_4_ = fVar230 * fVar230 * -fVar207;
    auVar112._12_4_ = fVar231 * fVar231 * -fVar238;
    auVar112._16_4_ = -fVar235 * 0.0 * 0.0;
    auVar112._20_4_ = -fVar151 * 0.0 * 0.0;
    auVar112._24_4_ = -fVar239 * 0.0 * 0.0;
    auVar112._28_4_ = -fVar240;
    auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar82 = vmulps_avx512vl(auVar111,auVar80);
    auVar93 = vmulps_avx512vl(auVar187,auVar80);
    auVar79 = vmulps_avx512vl(auVar205,auVar80);
    auVar94 = vmulps_avx512vl(auVar112,auVar80);
    auVar95 = vmulps_avx512vl(local_5c0,auVar94);
    auVar96 = vmulps_avx512vl(local_5e0,auVar94);
    auVar113._4_4_ = auVar218._4_4_ * auVar94._4_4_;
    auVar113._0_4_ = auVar218._0_4_ * auVar94._0_4_;
    auVar113._8_4_ = auVar218._8_4_ * auVar94._8_4_;
    auVar113._12_4_ = auVar218._12_4_ * auVar94._12_4_;
    auVar113._16_4_ = auVar218._16_4_ * auVar94._16_4_;
    auVar113._20_4_ = auVar218._20_4_ * auVar94._20_4_;
    auVar113._24_4_ = auVar218._24_4_ * auVar94._24_4_;
    auVar113._28_4_ = 0x40000000;
    auVar115._4_4_ = (float)local_540._4_4_ * auVar94._4_4_;
    auVar115._0_4_ = (float)local_540._0_4_ * auVar94._0_4_;
    auVar115._8_4_ = fStack_538 * auVar94._8_4_;
    auVar115._12_4_ = fStack_534 * auVar94._12_4_;
    auVar115._16_4_ = fStack_530 * auVar94._16_4_;
    auVar115._20_4_ = fStack_52c * auVar94._20_4_;
    auVar115._24_4_ = fStack_528 * auVar94._24_4_;
    auVar115._28_4_ = auVar94._28_4_;
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar79,auVar92);
    auVar95 = vfmadd231ps_avx512vl(auVar96,auVar79,auVar172._0_32_);
    auVar69 = vfmadd231ps_fma(auVar113,auVar79,local_5a0);
    auVar71 = vfmadd231ps_fma(auVar115,local_520,auVar79);
    auVar79 = vfmadd231ps_avx512vl(auVar94,auVar93,auVar88);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar93,auVar89);
    auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar69),auVar93,auVar90);
    auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar71),auVar91,auVar93);
    local_7c0 = vfmadd231ps_avx512vl(auVar79,auVar82,auVar85);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar82,auVar86);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar82,auVar134._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar87,auVar82);
    auVar116._4_4_ = (fVar233 + fVar233) * fVar229;
    auVar116._0_4_ = (fVar232 + fVar232) * fVar228;
    auVar116._8_4_ = (fVar207 + fVar207) * fVar230;
    auVar116._12_4_ = (fVar238 + fVar238) * fVar231;
    auVar116._16_4_ = (fVar235 + fVar235) * 0.0;
    auVar116._20_4_ = (fVar151 + fVar151) * 0.0;
    auVar116._24_4_ = (fVar239 + fVar239) * 0.0;
    auVar116._28_4_ = auVar93._28_4_;
    auVar82 = vsubps_avx(auVar116,auVar140._0_32_);
    auVar224._0_28_ =
         ZEXT1628(CONCAT412((fVar231 + fVar231) * (fVar247 + -5.0) + fVar247 * fVar231,
                            CONCAT48((fVar230 + fVar230) * (fVar246 + -5.0) + fVar246 * fVar230,
                                     CONCAT44((fVar229 + fVar229) * (fVar245 + -5.0) +
                                              fVar245 * fVar229,
                                              (fVar228 + fVar228) * (fVar242 + -5.0) +
                                              fVar242 * fVar228))));
    auVar224._28_4_ = auVar244._28_4_ + -5.0 + 0.0;
    auVar105._8_4_ = 0x40000000;
    auVar105._0_8_ = 0x4000000040000000;
    auVar105._12_4_ = 0x40000000;
    auVar105._16_4_ = 0x40000000;
    auVar105._20_4_ = 0x40000000;
    auVar105._24_4_ = 0x40000000;
    auVar105._28_4_ = 0x40000000;
    auVar93 = vaddps_avx512vl(auVar241._0_32_,auVar105);
    auVar117._4_4_ = (fVar233 + fVar233) * auVar93._4_4_;
    auVar117._0_4_ = (fVar232 + fVar232) * auVar93._0_4_;
    auVar117._8_4_ = (fVar207 + fVar207) * auVar93._8_4_;
    auVar117._12_4_ = (fVar238 + fVar238) * auVar93._12_4_;
    auVar117._16_4_ = (fVar235 + fVar235) * auVar93._16_4_;
    auVar117._20_4_ = (fVar151 + fVar151) * auVar93._20_4_;
    auVar117._24_4_ = (fVar239 + fVar239) * auVar93._24_4_;
    auVar117._28_4_ = auVar93._28_4_;
    auVar120._4_4_ = fVar233 * 3.0 * fVar233;
    auVar120._0_4_ = fVar232 * 3.0 * fVar232;
    auVar120._8_4_ = fVar207 * 3.0 * fVar207;
    auVar120._12_4_ = fVar238 * 3.0 * fVar238;
    auVar120._16_4_ = fVar235 * 3.0 * fVar235;
    auVar120._20_4_ = fVar151 * 3.0 * fVar151;
    auVar120._24_4_ = fVar239 * 3.0 * fVar239;
    auVar120._28_4_ = fVar240;
    auVar93 = vsubps_avx(auVar117,auVar120);
    auVar79 = vsubps_avx(auVar253._0_32_,auVar116);
    auVar97 = vmulps_avx512vl(auVar82,auVar80);
    auVar98 = vmulps_avx512vl(auVar224,auVar80);
    auVar93 = vmulps_avx512vl(auVar93,auVar80);
    auVar79 = vmulps_avx512vl(auVar79,auVar80);
    auVar80 = vmulps_avx512vl(local_5c0,auVar79);
    auVar99 = vmulps_avx512vl(local_5e0,auVar79);
    auVar121._4_4_ = auVar79._4_4_ * (float)local_800._4_4_;
    auVar121._0_4_ = auVar79._0_4_ * (float)local_800._0_4_;
    auVar121._8_4_ = auVar79._8_4_ * fStack_7f8;
    auVar121._12_4_ = auVar79._12_4_ * fStack_7f4;
    auVar121._16_4_ = auVar79._16_4_ * fStack_7f0;
    auVar121._20_4_ = auVar79._20_4_ * fStack_7ec;
    auVar121._24_4_ = auVar79._24_4_ * fStack_7e8;
    auVar121._28_4_ = fVar240 + fVar240;
    auVar122._4_4_ = auVar79._4_4_ * (float)local_540._4_4_;
    auVar122._0_4_ = auVar79._0_4_ * (float)local_540._0_4_;
    auVar122._8_4_ = auVar79._8_4_ * fStack_538;
    auVar122._12_4_ = auVar79._12_4_ * fStack_534;
    auVar122._16_4_ = auVar79._16_4_ * fStack_530;
    auVar122._20_4_ = auVar79._20_4_ * fStack_52c;
    auVar122._24_4_ = auVar79._24_4_ * fStack_528;
    auVar122._28_4_ = auVar79._28_4_;
    auVar79 = vfmadd231ps_avx512vl(auVar80,auVar93,auVar92);
    auVar80 = vfmadd231ps_avx512vl(auVar99,auVar93,auVar172._0_32_);
    auVar69 = vfmadd231ps_fma(auVar121,auVar93,local_5a0);
    auVar71 = vfmadd231ps_fma(auVar122,local_520,auVar93);
    auVar93 = vfmadd231ps_avx512vl(auVar79,auVar98,auVar88);
    auVar79 = vfmadd231ps_avx512vl(auVar80,auVar98,auVar89);
    auVar80 = vfmadd231ps_avx512vl(ZEXT1632(auVar69),auVar98,auVar90);
    auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar71),auVar91,auVar98);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar97,auVar85);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar97,auVar86);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar97,auVar134._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar98,auVar87,auVar97);
    auVar123._4_4_ = auVar93._4_4_ * fVar234;
    auVar123._0_4_ = auVar93._0_4_ * fVar234;
    auVar123._8_4_ = auVar93._8_4_ * fVar234;
    auVar123._12_4_ = auVar93._12_4_ * fVar234;
    auVar123._16_4_ = auVar93._16_4_ * fVar234;
    auVar123._20_4_ = auVar93._20_4_ * fVar234;
    auVar123._24_4_ = auVar93._24_4_ * fVar234;
    auVar123._28_4_ = auVar82._28_4_;
    auVar249 = ZEXT3264(auVar123);
    auVar34._4_4_ = auVar79._4_4_ * fVar234;
    auVar34._0_4_ = auVar79._0_4_ * fVar234;
    auVar34._8_4_ = auVar79._8_4_ * fVar234;
    auVar34._12_4_ = auVar79._12_4_ * fVar234;
    auVar34._16_4_ = auVar79._16_4_ * fVar234;
    auVar34._20_4_ = auVar79._20_4_ * fVar234;
    auVar34._24_4_ = auVar79._24_4_ * fVar234;
    auVar34._28_4_ = auVar79._28_4_;
    auVar252 = ZEXT3264(auVar34);
    auVar35._4_4_ = auVar80._4_4_ * fVar234;
    auVar35._0_4_ = auVar80._0_4_ * fVar234;
    auVar35._8_4_ = auVar80._8_4_ * fVar234;
    auVar35._12_4_ = auVar80._12_4_ * fVar234;
    auVar35._16_4_ = auVar80._16_4_ * fVar234;
    auVar35._20_4_ = auVar80._20_4_ * fVar234;
    auVar35._24_4_ = auVar80._24_4_ * fVar234;
    auVar35._28_4_ = auVar80._28_4_;
    fVar228 = auVar97._0_4_ * fVar234;
    fVar229 = auVar97._4_4_ * fVar234;
    auVar36._4_4_ = fVar229;
    auVar36._0_4_ = fVar228;
    fVar230 = auVar97._8_4_ * fVar234;
    auVar36._8_4_ = fVar230;
    fVar231 = auVar97._12_4_ * fVar234;
    auVar36._12_4_ = fVar231;
    fVar232 = auVar97._16_4_ * fVar234;
    auVar36._16_4_ = fVar232;
    fVar233 = auVar97._20_4_ * fVar234;
    auVar36._20_4_ = fVar233;
    fVar234 = auVar97._24_4_ * fVar234;
    auVar36._24_4_ = fVar234;
    auVar36._28_4_ = local_520._28_4_;
    auVar69 = vxorps_avx512vl(auVar172._0_16_,auVar172._0_16_);
    auVar80 = vpermt2ps_avx512vl(local_7c0,_DAT_0205fd20,ZEXT1632(auVar69));
    auVar241 = ZEXT3264(auVar80);
    auVar97 = vpermt2ps_avx512vl(auVar94,_DAT_0205fd20,ZEXT1632(auVar69));
    auVar244 = ZEXT3264(auVar97);
    auVar79 = ZEXT1632(auVar69);
    auVar98 = vpermt2ps_avx512vl(auVar95,_DAT_0205fd20,auVar79);
    auVar225._0_4_ = auVar96._0_4_ + fVar228;
    auVar225._4_4_ = auVar96._4_4_ + fVar229;
    auVar225._8_4_ = auVar96._8_4_ + fVar230;
    auVar225._12_4_ = auVar96._12_4_ + fVar231;
    auVar225._16_4_ = auVar96._16_4_ + fVar232;
    auVar225._20_4_ = auVar96._20_4_ + fVar233;
    auVar225._24_4_ = auVar96._24_4_ + fVar234;
    auVar225._28_4_ = auVar96._28_4_ + local_520._28_4_;
    auVar82 = vmaxps_avx(auVar96,auVar225);
    auVar93 = vminps_avx(auVar96,auVar225);
    auVar96 = vpermt2ps_avx512vl(auVar96,_DAT_0205fd20,auVar79);
    auVar99 = vpermt2ps_avx512vl(auVar123,_DAT_0205fd20,auVar79);
    auVar100 = vpermt2ps_avx512vl(auVar34,_DAT_0205fd20,auVar79);
    auVar116 = ZEXT1632(auVar69);
    auVar101 = vpermt2ps_avx512vl(auVar35,_DAT_0205fd20,auVar116);
    auVar79 = vpermt2ps_avx512vl(auVar36,_DAT_0205fd20,auVar116);
    auVar102 = vsubps_avx512vl(auVar96,auVar79);
    auVar103 = vsubps_avx512vl(auVar80,local_7c0);
    auVar79 = vsubps_avx(auVar97,auVar94);
    auVar104 = vsubps_avx512vl(auVar98,auVar95);
    auVar105 = vmulps_avx512vl(auVar79,auVar35);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar34,auVar104);
    auVar106 = vmulps_avx512vl(auVar104,auVar123);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar35,auVar103);
    auVar107 = vmulps_avx512vl(auVar103,auVar34);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar123,auVar79);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar106 = vmulps_avx512vl(auVar104,auVar104);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar79,auVar79);
    auVar108 = vfmadd231ps_avx512vl(auVar106,auVar103,auVar103);
    auVar107 = vrcp14ps_avx512vl(auVar108);
    auVar106._8_4_ = 0x3f800000;
    auVar106._0_8_ = &DAT_3f8000003f800000;
    auVar106._12_4_ = 0x3f800000;
    auVar106._16_4_ = 0x3f800000;
    auVar106._20_4_ = 0x3f800000;
    auVar106._24_4_ = 0x3f800000;
    auVar106._28_4_ = 0x3f800000;
    auVar106 = vfnmadd213ps_avx512vl(auVar107,auVar108,auVar106);
    auVar106 = vfmadd132ps_avx512vl(auVar106,auVar107,auVar107);
    auVar105 = vmulps_avx512vl(auVar105,auVar106);
    auVar107 = vmulps_avx512vl(auVar79,auVar101);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar100,auVar104);
    auVar109 = vmulps_avx512vl(auVar104,auVar99);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar101,auVar103);
    auVar110 = vmulps_avx512vl(auVar103,auVar100);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar99,auVar79);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar107 = vfmadd231ps_avx512vl(auVar109,auVar107,auVar107);
    auVar106 = vmulps_avx512vl(auVar107,auVar106);
    auVar105 = vmaxps_avx512vl(auVar105,auVar106);
    auVar105 = vsqrtps_avx512vl(auVar105);
    auVar106 = vmaxps_avx512vl(auVar102,auVar96);
    auVar82 = vmaxps_avx512vl(auVar82,auVar106);
    auVar106 = vaddps_avx512vl(auVar105,auVar82);
    auVar82 = vminps_avx512vl(auVar102,auVar96);
    auVar82 = vminps_avx(auVar93,auVar82);
    auVar82 = vsubps_avx512vl(auVar82,auVar105);
    auVar107._8_4_ = 0x3f800002;
    auVar107._0_8_ = 0x3f8000023f800002;
    auVar107._12_4_ = 0x3f800002;
    auVar107._16_4_ = 0x3f800002;
    auVar107._20_4_ = 0x3f800002;
    auVar107._24_4_ = 0x3f800002;
    auVar107._28_4_ = 0x3f800002;
    auVar93 = vmulps_avx512vl(auVar106,auVar107);
    auVar109._8_4_ = 0x3f7ffffc;
    auVar109._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar109._12_4_ = 0x3f7ffffc;
    auVar109._16_4_ = 0x3f7ffffc;
    auVar109._20_4_ = 0x3f7ffffc;
    auVar109._24_4_ = 0x3f7ffffc;
    auVar109._28_4_ = 0x3f7ffffc;
    auVar96 = vmulps_avx512vl(auVar82,auVar109);
    auVar37._4_4_ = auVar93._4_4_ * auVar93._4_4_;
    auVar37._0_4_ = auVar93._0_4_ * auVar93._0_4_;
    auVar37._8_4_ = auVar93._8_4_ * auVar93._8_4_;
    auVar37._12_4_ = auVar93._12_4_ * auVar93._12_4_;
    auVar37._16_4_ = auVar93._16_4_ * auVar93._16_4_;
    auVar37._20_4_ = auVar93._20_4_ * auVar93._20_4_;
    auVar37._24_4_ = auVar93._24_4_ * auVar93._24_4_;
    auVar37._28_4_ = auVar96._28_4_;
    auVar82 = vrsqrt14ps_avx512vl(auVar108);
    auVar110._8_4_ = 0xbf000000;
    auVar110._0_8_ = 0xbf000000bf000000;
    auVar110._12_4_ = 0xbf000000;
    auVar110._16_4_ = 0xbf000000;
    auVar110._20_4_ = 0xbf000000;
    auVar110._24_4_ = 0xbf000000;
    auVar110._28_4_ = 0xbf000000;
    auVar93 = vmulps_avx512vl(auVar108,auVar110);
    auVar38._4_4_ = auVar82._4_4_ * auVar93._4_4_;
    auVar38._0_4_ = auVar82._0_4_ * auVar93._0_4_;
    auVar38._8_4_ = auVar82._8_4_ * auVar93._8_4_;
    auVar38._12_4_ = auVar82._12_4_ * auVar93._12_4_;
    auVar38._16_4_ = auVar82._16_4_ * auVar93._16_4_;
    auVar38._20_4_ = auVar82._20_4_ * auVar93._20_4_;
    auVar38._24_4_ = auVar82._24_4_ * auVar93._24_4_;
    auVar38._28_4_ = auVar93._28_4_;
    auVar93 = vmulps_avx512vl(auVar82,auVar82);
    auVar93 = vmulps_avx512vl(auVar93,auVar38);
    auVar108._8_4_ = 0x3fc00000;
    auVar108._0_8_ = 0x3fc000003fc00000;
    auVar108._12_4_ = 0x3fc00000;
    auVar108._16_4_ = 0x3fc00000;
    auVar108._20_4_ = 0x3fc00000;
    auVar108._24_4_ = 0x3fc00000;
    auVar108._28_4_ = 0x3fc00000;
    auVar102 = vfmadd231ps_avx512vl(auVar93,auVar82,auVar108);
    auVar39._4_4_ = auVar102._4_4_ * auVar103._4_4_;
    auVar39._0_4_ = auVar102._0_4_ * auVar103._0_4_;
    auVar39._8_4_ = auVar102._8_4_ * auVar103._8_4_;
    auVar39._12_4_ = auVar102._12_4_ * auVar103._12_4_;
    auVar39._16_4_ = auVar102._16_4_ * auVar103._16_4_;
    auVar39._20_4_ = auVar102._20_4_ * auVar103._20_4_;
    auVar39._24_4_ = auVar102._24_4_ * auVar103._24_4_;
    auVar39._28_4_ = auVar82._28_4_;
    auVar82 = vmulps_avx512vl(auVar79,auVar102);
    auVar93 = vmulps_avx512vl(auVar104,auVar102);
    auVar105 = vsubps_avx512vl(auVar116,local_7c0);
    auVar106 = vsubps_avx512vl(auVar116,auVar94);
    auVar107 = vsubps_avx512vl(auVar116,auVar95);
    auVar109 = vmulps_avx512vl(local_680,auVar107);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar83,auVar106);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar84,auVar105);
    auVar110 = vmulps_avx512vl(auVar107,auVar107);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar106,auVar106);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar105,auVar105);
    auVar108 = vmulps_avx512vl(local_680,auVar93);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar82,auVar83);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar39,auVar84);
    auVar93 = vmulps_avx512vl(auVar107,auVar93);
    auVar82 = vfmadd231ps_avx512vl(auVar93,auVar106,auVar82);
    auVar111 = vfmadd231ps_avx512vl(auVar82,auVar105,auVar39);
    auVar112 = vmulps_avx512vl(auVar108,auVar108);
    auVar82 = vsubps_avx(local_560,auVar112);
    auVar93 = vmulps_avx512vl(auVar108,auVar111);
    auVar93 = vsubps_avx512vl(auVar109,auVar93);
    auVar109 = vaddps_avx512vl(auVar93,auVar93);
    auVar93 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vsubps_avx512vl(auVar110,auVar93);
    auVar93 = vsubps_avx(auVar110,auVar37);
    auVar113 = vmulps_avx512vl(auVar109,auVar109);
    auVar114._8_4_ = 0x40800000;
    auVar114._0_8_ = 0x4080000040800000;
    auVar114._12_4_ = 0x40800000;
    auVar114._16_4_ = 0x40800000;
    auVar114._20_4_ = 0x40800000;
    auVar114._24_4_ = 0x40800000;
    auVar114._28_4_ = 0x40800000;
    auVar114 = vmulps_avx512vl(auVar82,auVar114);
    auVar115 = vmulps_avx512vl(auVar114,auVar93);
    auVar115 = vsubps_avx512vl(auVar113,auVar115);
    uVar67 = vcmpps_avx512vl(auVar115,auVar116,5);
    bVar53 = (byte)uVar67;
    if (bVar53 == 0) {
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar115 = vsqrtps_avx512vl(auVar115);
      auVar116 = vaddps_avx512vl(auVar82,auVar82);
      auVar117 = vrcp14ps_avx512vl(auVar116);
      auVar22._8_4_ = 0x3f800000;
      auVar22._0_8_ = &DAT_3f8000003f800000;
      auVar22._12_4_ = 0x3f800000;
      auVar22._16_4_ = 0x3f800000;
      auVar22._20_4_ = 0x3f800000;
      auVar22._24_4_ = 0x3f800000;
      auVar22._28_4_ = 0x3f800000;
      auVar116 = vfnmadd213ps_avx512vl(auVar116,auVar117,auVar22);
      auVar116 = vfmadd132ps_avx512vl(auVar116,auVar117,auVar117);
      auVar23._8_4_ = 0x80000000;
      auVar23._0_8_ = 0x8000000080000000;
      auVar23._12_4_ = 0x80000000;
      auVar23._16_4_ = 0x80000000;
      auVar23._20_4_ = 0x80000000;
      auVar23._24_4_ = 0x80000000;
      auVar23._28_4_ = 0x80000000;
      auVar117 = vxorps_avx512vl(auVar109,auVar23);
      auVar117 = vsubps_avx512vl(auVar117,auVar115);
      auVar117 = vmulps_avx512vl(auVar117,auVar116);
      auVar115 = vsubps_avx512vl(auVar115,auVar109);
      auVar115 = vmulps_avx512vl(auVar115,auVar116);
      auVar116 = vfmadd213ps_avx512vl(auVar108,auVar117,auVar111);
      local_6e0 = vmulps_avx512vl(auVar102,auVar116);
      auVar116 = vfmadd213ps_avx512vl(auVar108,auVar115,auVar111);
      local_700 = vmulps_avx512vl(auVar102,auVar116);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar116 = vblendmps_avx512vl(auVar116,auVar117);
      auVar118._0_4_ =
           (uint)(bVar53 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar53 & 1) * local_700._0_4_;
      bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar65 * auVar116._4_4_ | (uint)!bVar65 * local_700._4_4_;
      bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar65 * auVar116._8_4_ | (uint)!bVar65 * local_700._8_4_;
      bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar65 * auVar116._12_4_ | (uint)!bVar65 * local_700._12_4_;
      bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar118._16_4_ = (uint)bVar65 * auVar116._16_4_ | (uint)!bVar65 * local_700._16_4_;
      bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar118._20_4_ = (uint)bVar65 * auVar116._20_4_ | (uint)!bVar65 * local_700._20_4_;
      bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar118._24_4_ = (uint)bVar65 * auVar116._24_4_ | (uint)!bVar65 * local_700._24_4_;
      bVar65 = SUB81(uVar67 >> 7,0);
      auVar118._28_4_ = (uint)bVar65 * auVar116._28_4_ | (uint)!bVar65 * local_700._28_4_;
      auVar214._8_4_ = 0xff800000;
      auVar214._0_8_ = 0xff800000ff800000;
      auVar214._12_4_ = 0xff800000;
      auVar214._16_4_ = 0xff800000;
      auVar214._20_4_ = 0xff800000;
      auVar214._24_4_ = 0xff800000;
      auVar214._28_4_ = 0xff800000;
      auVar116 = vblendmps_avx512vl(auVar214,auVar115);
      auVar119._0_4_ =
           (uint)(bVar53 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar115._0_4_;
      bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar65 * auVar116._4_4_ | (uint)!bVar65 * auVar115._4_4_;
      bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar65 * auVar116._8_4_ | (uint)!bVar65 * auVar115._8_4_;
      bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar65 * auVar116._12_4_ | (uint)!bVar65 * auVar115._12_4_;
      bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
      auVar119._16_4_ = (uint)bVar65 * auVar116._16_4_ | (uint)!bVar65 * auVar115._16_4_;
      bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
      auVar119._20_4_ = (uint)bVar65 * auVar116._20_4_ | (uint)!bVar65 * auVar115._20_4_;
      bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
      auVar119._24_4_ = (uint)bVar65 * auVar116._24_4_ | (uint)!bVar65 * auVar115._24_4_;
      bVar65 = SUB81(uVar67 >> 7,0);
      auVar119._28_4_ = (uint)bVar65 * auVar116._28_4_ | (uint)!bVar65 * auVar115._28_4_;
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar112,auVar115);
      auVar116 = vmaxps_avx512vl(local_6a0,auVar115);
      auVar24._8_4_ = 0x36000000;
      auVar24._0_8_ = 0x3600000036000000;
      auVar24._12_4_ = 0x36000000;
      auVar24._16_4_ = 0x36000000;
      auVar24._20_4_ = 0x36000000;
      auVar24._24_4_ = 0x36000000;
      auVar24._28_4_ = 0x36000000;
      auVar116 = vmulps_avx512vl(auVar116,auVar24);
      vandps_avx512vl(auVar82,auVar115);
      uVar57 = vcmpps_avx512vl(auVar116,auVar116,1);
      uVar67 = uVar67 & uVar57;
      bVar59 = (byte)uVar67;
      if (bVar59 != 0) {
        uVar57 = vcmpps_avx512vl(auVar93,_DAT_02020f00,2);
        auVar227._8_4_ = 0xff800000;
        auVar227._0_8_ = 0xff800000ff800000;
        auVar227._12_4_ = 0xff800000;
        auVar227._16_4_ = 0xff800000;
        auVar227._20_4_ = 0xff800000;
        auVar227._24_4_ = 0xff800000;
        auVar227._28_4_ = 0xff800000;
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar115 = vblendmps_avx512vl(auVar93,auVar227);
        bVar56 = (byte)uVar57;
        uVar68 = (uint)(bVar56 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar116._0_4_;
        bVar65 = (bool)((byte)(uVar57 >> 1) & 1);
        uVar142 = (uint)bVar65 * auVar115._4_4_ | (uint)!bVar65 * auVar116._4_4_;
        bVar65 = (bool)((byte)(uVar57 >> 2) & 1);
        uVar143 = (uint)bVar65 * auVar115._8_4_ | (uint)!bVar65 * auVar116._8_4_;
        bVar65 = (bool)((byte)(uVar57 >> 3) & 1);
        uVar144 = (uint)bVar65 * auVar115._12_4_ | (uint)!bVar65 * auVar116._12_4_;
        bVar65 = (bool)((byte)(uVar57 >> 4) & 1);
        uVar145 = (uint)bVar65 * auVar115._16_4_ | (uint)!bVar65 * auVar116._16_4_;
        bVar65 = (bool)((byte)(uVar57 >> 5) & 1);
        uVar146 = (uint)bVar65 * auVar115._20_4_ | (uint)!bVar65 * auVar116._20_4_;
        bVar65 = (bool)((byte)(uVar57 >> 6) & 1);
        uVar147 = (uint)bVar65 * auVar115._24_4_ | (uint)!bVar65 * auVar116._24_4_;
        bVar65 = SUB81(uVar57 >> 7,0);
        uVar148 = (uint)bVar65 * auVar115._28_4_ | (uint)!bVar65 * auVar116._28_4_;
        auVar118._0_4_ = (bVar59 & 1) * uVar68 | !(bool)(bVar59 & 1) * auVar118._0_4_;
        bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar118._4_4_ = bVar65 * uVar142 | !bVar65 * auVar118._4_4_;
        bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar118._8_4_ = bVar65 * uVar143 | !bVar65 * auVar118._8_4_;
        bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar118._12_4_ = bVar65 * uVar144 | !bVar65 * auVar118._12_4_;
        bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar118._16_4_ = bVar65 * uVar145 | !bVar65 * auVar118._16_4_;
        bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar118._20_4_ = bVar65 * uVar146 | !bVar65 * auVar118._20_4_;
        bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar118._24_4_ = bVar65 * uVar147 | !bVar65 * auVar118._24_4_;
        bVar65 = SUB81(uVar67 >> 7,0);
        auVar118._28_4_ = bVar65 * uVar148 | !bVar65 * auVar118._28_4_;
        auVar93 = vblendmps_avx512vl(auVar227,auVar93);
        bVar65 = (bool)((byte)(uVar57 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar57 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar57 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar57 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar57 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar57 >> 6) & 1);
        bVar11 = SUB81(uVar57 >> 7,0);
        auVar119._0_4_ =
             (uint)(bVar59 & 1) *
             ((uint)(bVar56 & 1) * auVar93._0_4_ | !(bool)(bVar56 & 1) * uVar68) |
             !(bool)(bVar59 & 1) * auVar119._0_4_;
        bVar5 = (bool)((byte)(uVar67 >> 1) & 1);
        auVar119._4_4_ =
             (uint)bVar5 * ((uint)bVar65 * auVar93._4_4_ | !bVar65 * uVar142) |
             !bVar5 * auVar119._4_4_;
        bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
        auVar119._8_4_ =
             (uint)bVar65 * ((uint)bVar6 * auVar93._8_4_ | !bVar6 * uVar143) |
             !bVar65 * auVar119._8_4_;
        bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
        auVar119._12_4_ =
             (uint)bVar65 * ((uint)bVar7 * auVar93._12_4_ | !bVar7 * uVar144) |
             !bVar65 * auVar119._12_4_;
        bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
        auVar119._16_4_ =
             (uint)bVar65 * ((uint)bVar8 * auVar93._16_4_ | !bVar8 * uVar145) |
             !bVar65 * auVar119._16_4_;
        bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
        auVar119._20_4_ =
             (uint)bVar65 * ((uint)bVar9 * auVar93._20_4_ | !bVar9 * uVar146) |
             !bVar65 * auVar119._20_4_;
        bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
        auVar119._24_4_ =
             (uint)bVar65 * ((uint)bVar10 * auVar93._24_4_ | !bVar10 * uVar147) |
             !bVar65 * auVar119._24_4_;
        bVar65 = SUB81(uVar67 >> 7,0);
        auVar119._28_4_ =
             (uint)bVar65 * ((uint)bVar11 * auVar93._28_4_ | !bVar11 * uVar148) |
             !bVar65 * auVar119._28_4_;
        bVar53 = (~bVar59 | bVar56) & bVar53;
      }
    }
    auVar162._8_4_ = 0x3f800000;
    auVar162._0_8_ = &DAT_3f8000003f800000;
    auVar162._12_4_ = 0x3f800000;
    auVar162._16_4_ = 0x3f800000;
    auVar162._20_4_ = 0x3f800000;
    auVar162._24_4_ = 0x3f800000;
    auVar162._28_4_ = 0x3f800000;
    auVar218 = ZEXT3264(_local_800);
    if ((bVar53 & 0x7f) == 0) {
      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar253 = ZEXT3264(auVar82);
      auVar172._32_32_ = auVar81;
      auVar141 = auVar172;
    }
    else {
      fVar234 = *(float *)(ray + k * 4 + 0x200) - (float)local_870._0_4_;
      auVar215._4_4_ = fVar234;
      auVar215._0_4_ = fVar234;
      auVar215._8_4_ = fVar234;
      auVar215._12_4_ = fVar234;
      auVar215._16_4_ = fVar234;
      auVar215._20_4_ = fVar234;
      auVar215._24_4_ = fVar234;
      auVar215._28_4_ = fVar234;
      auVar115 = vminps_avx512vl(auVar215,auVar119);
      auVar52._4_4_ = fStack_57c;
      auVar52._0_4_ = local_580;
      auVar52._8_4_ = fStack_578;
      auVar52._12_4_ = fStack_574;
      auVar52._16_4_ = fStack_570;
      auVar52._20_4_ = fStack_56c;
      auVar52._24_4_ = fStack_568;
      auVar52._28_4_ = fStack_564;
      auVar93 = vmaxps_avx512vl(auVar52,auVar118);
      auVar107 = vmulps_avx512vl(auVar107,auVar35);
      auVar106 = vfmadd213ps_avx512vl(auVar106,auVar34,auVar107);
      auVar105 = vfmadd213ps_avx512vl(auVar105,auVar123,auVar106);
      auVar106 = vmulps_avx512vl(local_680,auVar35);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar83,auVar34);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar84,auVar123);
      auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar253 = ZEXT3264(auVar107);
      vandps_avx512vl(auVar106,auVar107);
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar14 = vcmpps_avx512vl(auVar107,auVar116,1);
      auVar117 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar105 = vxorps_avx512vl(auVar105,auVar117);
      auVar120 = vrcp14ps_avx512vl(auVar106);
      auVar121 = vxorps_avx512vl(auVar106,auVar117);
      auVar122 = vfnmadd213ps_avx512vl(auVar120,auVar106,auVar162);
      auVar122 = vfmadd132ps_avx512vl(auVar122,auVar120,auVar120);
      auVar105 = vmulps_avx512vl(auVar122,auVar105);
      uVar16 = vcmpps_avx512vl(auVar106,auVar121,1);
      bVar59 = (byte)uVar14 | (byte)uVar16;
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar123 = vblendmps_avx512vl(auVar105,auVar122);
      auVar124._0_4_ =
           (uint)(bVar59 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar120._0_4_;
      bVar65 = (bool)(bVar59 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar65 * auVar123._4_4_ | (uint)!bVar65 * auVar120._4_4_;
      bVar65 = (bool)(bVar59 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar65 * auVar123._8_4_ | (uint)!bVar65 * auVar120._8_4_;
      bVar65 = (bool)(bVar59 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar65 * auVar123._12_4_ | (uint)!bVar65 * auVar120._12_4_;
      bVar65 = (bool)(bVar59 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar65 * auVar123._16_4_ | (uint)!bVar65 * auVar120._16_4_;
      bVar65 = (bool)(bVar59 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar65 * auVar123._20_4_ | (uint)!bVar65 * auVar120._20_4_;
      bVar65 = (bool)(bVar59 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar65 * auVar123._24_4_ | (uint)!bVar65 * auVar120._24_4_;
      auVar124._28_4_ =
           (uint)(bVar59 >> 7) * auVar123._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar120._28_4_;
      auVar93 = vmaxps_avx(auVar93,auVar124);
      uVar16 = vcmpps_avx512vl(auVar106,auVar121,6);
      bVar59 = (byte)uVar14 | (byte)uVar16;
      auVar125._0_4_ = (uint)(bVar59 & 1) * 0x7f800000 | (uint)!(bool)(bVar59 & 1) * auVar105._0_4_;
      bVar65 = (bool)(bVar59 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * auVar105._4_4_;
      bVar65 = (bool)(bVar59 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * auVar105._8_4_;
      bVar65 = (bool)(bVar59 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * auVar105._12_4_;
      bVar65 = (bool)(bVar59 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * auVar105._16_4_;
      bVar65 = (bool)(bVar59 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * auVar105._20_4_;
      bVar65 = (bool)(bVar59 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * auVar105._24_4_;
      auVar125._28_4_ =
           (uint)(bVar59 >> 7) * 0x7f800000 | (uint)!(bool)(bVar59 >> 7) * auVar105._28_4_;
      auVar105 = vminps_avx(auVar115,auVar125);
      auVar69 = vxorps_avx512vl(auVar121._0_16_,auVar121._0_16_);
      auVar80 = vsubps_avx512vl(ZEXT1632(auVar69),auVar80);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar69),auVar97);
      auVar106 = ZEXT1632(auVar69);
      auVar98 = vsubps_avx512vl(auVar106,auVar98);
      auVar40._4_4_ = auVar98._4_4_ * auVar101._4_4_;
      auVar40._0_4_ = auVar98._0_4_ * auVar101._0_4_;
      auVar40._8_4_ = auVar98._8_4_ * auVar101._8_4_;
      auVar40._12_4_ = auVar98._12_4_ * auVar101._12_4_;
      auVar40._16_4_ = auVar98._16_4_ * auVar101._16_4_;
      auVar40._20_4_ = auVar98._20_4_ * auVar101._20_4_;
      auVar40._24_4_ = auVar98._24_4_ * auVar101._24_4_;
      auVar40._28_4_ = auVar98._28_4_;
      auVar97 = vfnmsub231ps_avx512vl(auVar40,auVar100,auVar97);
      auVar80 = vfnmadd231ps_avx512vl(auVar97,auVar99,auVar80);
      auVar97 = vmulps_avx512vl(local_680,auVar101);
      auVar97 = vfnmsub231ps_avx512vl(auVar97,auVar83,auVar100);
      auVar97 = vfnmadd231ps_avx512vl(auVar97,auVar84,auVar99);
      vandps_avx512vl(auVar97,auVar107);
      uVar14 = vcmpps_avx512vl(auVar97,auVar116,1);
      auVar80 = vxorps_avx512vl(auVar80,auVar117);
      auVar98 = vrcp14ps_avx512vl(auVar97);
      auVar99 = vxorps_avx512vl(auVar97,auVar117);
      auVar249 = ZEXT3264(auVar99);
      auVar69 = vfnmadd213ps_fma(auVar98,auVar97,auVar162);
      auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar98,auVar98);
      auVar252 = ZEXT1664(auVar69);
      fVar234 = auVar69._0_4_ * auVar80._0_4_;
      fVar228 = auVar69._4_4_ * auVar80._4_4_;
      auVar41._4_4_ = fVar228;
      auVar41._0_4_ = fVar234;
      fVar229 = auVar69._8_4_ * auVar80._8_4_;
      auVar41._8_4_ = fVar229;
      fVar230 = auVar69._12_4_ * auVar80._12_4_;
      auVar41._12_4_ = fVar230;
      fVar231 = auVar80._16_4_ * 0.0;
      auVar41._16_4_ = fVar231;
      fVar232 = auVar80._20_4_ * 0.0;
      auVar41._20_4_ = fVar232;
      fVar233 = auVar80._24_4_ * 0.0;
      auVar41._24_4_ = fVar233;
      auVar41._28_4_ = auVar80._28_4_;
      uVar16 = vcmpps_avx512vl(auVar97,auVar99,1);
      bVar59 = (byte)uVar14 | (byte)uVar16;
      auVar100 = vblendmps_avx512vl(auVar41,auVar122);
      auVar126._0_4_ =
           (uint)(bVar59 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar98._0_4_;
      bVar65 = (bool)(bVar59 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar65 * auVar100._4_4_ | (uint)!bVar65 * auVar98._4_4_;
      bVar65 = (bool)(bVar59 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar65 * auVar100._8_4_ | (uint)!bVar65 * auVar98._8_4_;
      bVar65 = (bool)(bVar59 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar65 * auVar100._12_4_ | (uint)!bVar65 * auVar98._12_4_;
      bVar65 = (bool)(bVar59 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar65 * auVar100._16_4_ | (uint)!bVar65 * auVar98._16_4_;
      bVar65 = (bool)(bVar59 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar65 * auVar100._20_4_ | (uint)!bVar65 * auVar98._20_4_;
      bVar65 = (bool)(bVar59 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar65 * auVar100._24_4_ | (uint)!bVar65 * auVar98._24_4_;
      auVar126._28_4_ =
           (uint)(bVar59 >> 7) * auVar100._28_4_ | (uint)!(bool)(bVar59 >> 7) * auVar98._28_4_;
      _local_7e0 = vmaxps_avx(auVar93,auVar126);
      uVar16 = vcmpps_avx512vl(auVar97,auVar99,6);
      bVar59 = (byte)uVar14 | (byte)uVar16;
      auVar127._0_4_ = (uint)(bVar59 & 1) * 0x7f800000 | (uint)!(bool)(bVar59 & 1) * (int)fVar234;
      bVar65 = (bool)(bVar59 >> 1 & 1);
      auVar127._4_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar228;
      bVar65 = (bool)(bVar59 >> 2 & 1);
      auVar127._8_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar229;
      bVar65 = (bool)(bVar59 >> 3 & 1);
      auVar127._12_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar230;
      bVar65 = (bool)(bVar59 >> 4 & 1);
      auVar127._16_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar231;
      bVar65 = (bool)(bVar59 >> 5 & 1);
      auVar127._20_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar232;
      bVar65 = (bool)(bVar59 >> 6 & 1);
      auVar127._24_4_ = (uint)bVar65 * 0x7f800000 | (uint)!bVar65 * (int)fVar233;
      auVar127._28_4_ =
           (uint)(bVar59 >> 7) * 0x7f800000 | (uint)!(bool)(bVar59 >> 7) * auVar80._28_4_;
      auVar244 = ZEXT3264(auVar127);
      local_640 = vminps_avx(auVar105,auVar127);
      auVar241 = ZEXT3264(local_640);
      uVar14 = vcmpps_avx512vl(_local_7e0,local_640,2);
      bVar53 = bVar53 & 0x7f & (byte)uVar14;
      if (bVar53 == 0) {
        auVar141._32_32_ = auVar81;
        auVar141._0_32_ = auVar172._0_32_;
      }
      else {
        auVar97 = vmaxps_avx512vl(auVar106,auVar96);
        auVar93 = vminps_avx(local_6e0,auVar162);
        auVar47 = ZEXT412(0);
        auVar96 = ZEXT1232(auVar47) << 0x20;
        auVar93 = vmaxps_avx(auVar93,ZEXT1232(auVar47) << 0x20);
        auVar80 = vminps_avx(local_700,auVar162);
        auVar252 = ZEXT3264(CONCAT428(0x3e000000,
                                      CONCAT424(0x3e000000,
                                                CONCAT420(0x3e000000,
                                                          CONCAT416(0x3e000000,
                                                                    CONCAT412(0x3e000000,
                                                                              CONCAT48(0x3e000000,
                                                                                                                                                                              
                                                  0x3e0000003e000000)))))));
        auVar42._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar93._28_4_ + 7.0;
        auVar69 = vfmadd213ps_fma(auVar42,auVar160,auVar223);
        local_6e0 = ZEXT1632(auVar69);
        auVar93 = vmaxps_avx(auVar80,ZEXT1232(auVar47) << 0x20);
        auVar43._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
        auVar43._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
        auVar43._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
        auVar43._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
        auVar43._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
        auVar43._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
        auVar43._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
        auVar43._28_4_ = auVar93._28_4_ + 7.0;
        auVar69 = vfmadd213ps_fma(auVar43,auVar160,auVar223);
        local_700 = ZEXT1632(auVar69);
        auVar216._0_4_ = auVar97._0_4_ * auVar97._0_4_;
        auVar216._4_4_ = auVar97._4_4_ * auVar97._4_4_;
        auVar216._8_4_ = auVar97._8_4_ * auVar97._8_4_;
        auVar216._12_4_ = auVar97._12_4_ * auVar97._12_4_;
        auVar216._16_4_ = auVar97._16_4_ * auVar97._16_4_;
        auVar216._20_4_ = auVar97._20_4_ * auVar97._20_4_;
        auVar216._24_4_ = auVar97._24_4_ * auVar97._24_4_;
        auVar216._28_4_ = 0;
        auVar93 = vsubps_avx512vl(auVar110,auVar216);
        auVar249 = ZEXT3264(auVar93);
        auVar80 = vmulps_avx512vl(auVar114,auVar93);
        auVar80 = vsubps_avx512vl(auVar113,auVar80);
        uVar14 = vcmpps_avx512vl(auVar80,ZEXT1232(auVar47) << 0x20,5);
        bVar59 = (byte)uVar14;
        if (bVar59 == 0) {
          auVar79 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar94 = ZEXT832(0) << 0x20;
          auVar80 = ZEXT832(0) << 0x20;
          auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar244 = ZEXT864(0) << 0x20;
          auVar128._8_4_ = 0x7f800000;
          auVar128._0_8_ = 0x7f8000007f800000;
          auVar128._12_4_ = 0x7f800000;
          auVar128._16_4_ = 0x7f800000;
          auVar128._20_4_ = 0x7f800000;
          auVar128._24_4_ = 0x7f800000;
          auVar128._28_4_ = 0x7f800000;
          auVar129._8_4_ = 0xff800000;
          auVar129._0_8_ = 0xff800000ff800000;
          auVar129._12_4_ = 0xff800000;
          auVar129._16_4_ = 0xff800000;
          auVar129._20_4_ = 0xff800000;
          auVar129._24_4_ = 0xff800000;
          auVar129._28_4_ = 0xff800000;
        }
        else {
          auVar71 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
          uVar67 = vcmpps_avx512vl(auVar80,auVar106,5);
          auVar80 = vsqrtps_avx(auVar80);
          auVar226._0_4_ = auVar82._0_4_ + auVar82._0_4_;
          auVar226._4_4_ = auVar82._4_4_ + auVar82._4_4_;
          auVar226._8_4_ = auVar82._8_4_ + auVar82._8_4_;
          auVar226._12_4_ = auVar82._12_4_ + auVar82._12_4_;
          auVar226._16_4_ = auVar82._16_4_ + auVar82._16_4_;
          auVar226._20_4_ = auVar82._20_4_ + auVar82._20_4_;
          auVar226._24_4_ = auVar82._24_4_ + auVar82._24_4_;
          auVar226._28_4_ = auVar82._28_4_ + auVar82._28_4_;
          auVar96 = vrcp14ps_avx512vl(auVar226);
          auVar69 = vfnmadd213ps_fma(auVar226,auVar96,auVar162);
          auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar96,auVar96);
          auVar25._8_4_ = 0x80000000;
          auVar25._0_8_ = 0x8000000080000000;
          auVar25._12_4_ = 0x80000000;
          auVar25._16_4_ = 0x80000000;
          auVar25._20_4_ = 0x80000000;
          auVar25._24_4_ = 0x80000000;
          auVar25._28_4_ = 0x80000000;
          auVar96 = vxorps_avx512vl(auVar109,auVar25);
          auVar96 = vsubps_avx(auVar96,auVar80);
          auVar44._4_4_ = auVar96._4_4_ * auVar69._4_4_;
          auVar44._0_4_ = auVar96._0_4_ * auVar69._0_4_;
          auVar44._8_4_ = auVar96._8_4_ * auVar69._8_4_;
          auVar44._12_4_ = auVar96._12_4_ * auVar69._12_4_;
          auVar44._16_4_ = auVar96._16_4_ * 0.0;
          auVar44._20_4_ = auVar96._20_4_ * 0.0;
          auVar44._24_4_ = auVar96._24_4_ * 0.0;
          auVar44._28_4_ = 0x3e000000;
          auVar252 = ZEXT3264(auVar44);
          auVar80 = vsubps_avx512vl(auVar80,auVar109);
          auVar45._4_4_ = auVar80._4_4_ * auVar69._4_4_;
          auVar45._0_4_ = auVar80._0_4_ * auVar69._0_4_;
          auVar45._8_4_ = auVar80._8_4_ * auVar69._8_4_;
          auVar45._12_4_ = auVar80._12_4_ * auVar69._12_4_;
          auVar45._16_4_ = auVar80._16_4_ * 0.0;
          auVar45._20_4_ = auVar80._20_4_ * 0.0;
          auVar45._24_4_ = auVar80._24_4_ * 0.0;
          auVar45._28_4_ = 0x7f800000;
          auVar80 = vfmadd213ps_avx512vl(auVar108,auVar44,auVar111);
          auVar46._4_4_ = auVar102._4_4_ * auVar80._4_4_;
          auVar46._0_4_ = auVar102._0_4_ * auVar80._0_4_;
          auVar46._8_4_ = auVar102._8_4_ * auVar80._8_4_;
          auVar46._12_4_ = auVar102._12_4_ * auVar80._12_4_;
          auVar46._16_4_ = auVar102._16_4_ * auVar80._16_4_;
          auVar46._20_4_ = auVar102._20_4_ * auVar80._20_4_;
          auVar46._24_4_ = auVar102._24_4_ * auVar80._24_4_;
          auVar46._28_4_ = auVar96._28_4_;
          auVar80 = vmulps_avx512vl(auVar84,auVar44);
          auVar96 = vmulps_avx512vl(auVar83,auVar44);
          auVar98 = vmulps_avx512vl(local_680,auVar44);
          auVar97 = vfmadd213ps_avx512vl(auVar103,auVar46,local_7c0);
          auVar80 = vsubps_avx512vl(auVar80,auVar97);
          auVar97 = vfmadd213ps_avx512vl(auVar79,auVar46,auVar94);
          auVar97 = vsubps_avx512vl(auVar96,auVar97);
          auVar69 = vfmadd213ps_fma(auVar46,auVar104,auVar95);
          auVar96 = vsubps_avx(auVar98,ZEXT1632(auVar69));
          auVar244 = ZEXT3264(auVar96);
          auVar96 = vfmadd213ps_avx512vl(auVar108,auVar45,auVar111);
          auVar98 = vmulps_avx512vl(auVar102,auVar96);
          auVar96 = vmulps_avx512vl(auVar84,auVar45);
          auVar99 = vmulps_avx512vl(auVar83,auVar45);
          auVar100 = vmulps_avx512vl(local_680,auVar45);
          auVar69 = vfmadd213ps_fma(auVar103,auVar98,local_7c0);
          auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar69));
          auVar69 = vfmadd213ps_fma(auVar79,auVar98,auVar94);
          auVar79 = vsubps_avx512vl(auVar99,ZEXT1632(auVar69));
          auVar69 = vfmadd213ps_fma(auVar104,auVar98,auVar95);
          auVar94 = vsubps_avx512vl(auVar100,ZEXT1632(auVar69));
          auVar163._8_4_ = 0x7f800000;
          auVar163._0_8_ = 0x7f8000007f800000;
          auVar163._12_4_ = 0x7f800000;
          auVar163._16_4_ = 0x7f800000;
          auVar163._20_4_ = 0x7f800000;
          auVar163._24_4_ = 0x7f800000;
          auVar163._28_4_ = 0x7f800000;
          auVar95 = vblendmps_avx512vl(auVar163,auVar44);
          bVar65 = (bool)((byte)uVar67 & 1);
          auVar128._0_4_ = (uint)bVar65 * auVar95._0_4_ | (uint)!bVar65 * local_7c0._0_4_;
          bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar65 * auVar95._4_4_ | (uint)!bVar65 * local_7c0._4_4_;
          bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar65 * auVar95._8_4_ | (uint)!bVar65 * local_7c0._8_4_;
          bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar65 * auVar95._12_4_ | (uint)!bVar65 * local_7c0._12_4_;
          bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar128._16_4_ = (uint)bVar65 * auVar95._16_4_ | (uint)!bVar65 * local_7c0._16_4_;
          bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar128._20_4_ = (uint)bVar65 * auVar95._20_4_ | (uint)!bVar65 * local_7c0._20_4_;
          bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar128._24_4_ = (uint)bVar65 * auVar95._24_4_ | (uint)!bVar65 * local_7c0._24_4_;
          bVar65 = SUB81(uVar67 >> 7,0);
          auVar128._28_4_ = (uint)bVar65 * auVar95._28_4_ | (uint)!bVar65 * local_7c0._28_4_;
          auVar164._8_4_ = 0xff800000;
          auVar164._0_8_ = 0xff800000ff800000;
          auVar164._12_4_ = 0xff800000;
          auVar164._16_4_ = 0xff800000;
          auVar164._20_4_ = 0xff800000;
          auVar164._24_4_ = 0xff800000;
          auVar164._28_4_ = 0xff800000;
          auVar95 = vblendmps_avx512vl(auVar164,auVar45);
          bVar65 = (bool)((byte)uVar67 & 1);
          auVar129._0_4_ = (uint)bVar65 * auVar95._0_4_ | (uint)!bVar65 * -0x800000;
          bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar65 * auVar95._4_4_ | (uint)!bVar65 * -0x800000;
          bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar65 * auVar95._8_4_ | (uint)!bVar65 * -0x800000;
          bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar65 * auVar95._12_4_ | (uint)!bVar65 * -0x800000;
          bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
          auVar129._16_4_ = (uint)bVar65 * auVar95._16_4_ | (uint)!bVar65 * -0x800000;
          bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
          auVar129._20_4_ = (uint)bVar65 * auVar95._20_4_ | (uint)!bVar65 * -0x800000;
          bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
          auVar129._24_4_ = (uint)bVar65 * auVar95._24_4_ | (uint)!bVar65 * -0x800000;
          bVar65 = SUB81(uVar67 >> 7,0);
          auVar129._28_4_ = (uint)bVar65 * auVar95._28_4_ | (uint)!bVar65 * -0x800000;
          vandps_avx512vl(auVar112,auVar107);
          auVar95 = vmaxps_avx(local_6a0,auVar129);
          auVar26._8_4_ = 0x36000000;
          auVar26._0_8_ = 0x3600000036000000;
          auVar26._12_4_ = 0x36000000;
          auVar26._16_4_ = 0x36000000;
          auVar26._20_4_ = 0x36000000;
          auVar26._24_4_ = 0x36000000;
          auVar26._28_4_ = 0x36000000;
          auVar95 = vmulps_avx512vl(auVar95,auVar26);
          vandps_avx512vl(auVar82,auVar107);
          uVar57 = vcmpps_avx512vl(auVar95,auVar95,1);
          uVar67 = uVar67 & uVar57;
          bVar56 = (byte)uVar67;
          if (bVar56 != 0) {
            uVar57 = vcmpps_avx512vl(auVar93,ZEXT1632(auVar71),2);
            auVar237._8_4_ = 0xff800000;
            auVar237._0_8_ = 0xff800000ff800000;
            auVar237._12_4_ = 0xff800000;
            auVar237._16_4_ = 0xff800000;
            auVar237._20_4_ = 0xff800000;
            auVar237._24_4_ = 0xff800000;
            auVar237._28_4_ = 0xff800000;
            auVar248._8_4_ = 0x7f800000;
            auVar248._0_8_ = 0x7f8000007f800000;
            auVar248._12_4_ = 0x7f800000;
            auVar248._16_4_ = 0x7f800000;
            auVar248._20_4_ = 0x7f800000;
            auVar248._24_4_ = 0x7f800000;
            auVar248._28_4_ = 0x7f800000;
            auVar249 = ZEXT3264(auVar248);
            auVar82 = vblendmps_avx512vl(auVar248,auVar237);
            bVar58 = (byte)uVar57;
            uVar68 = (uint)(bVar58 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar95._0_4_;
            bVar65 = (bool)((byte)(uVar57 >> 1) & 1);
            uVar142 = (uint)bVar65 * auVar82._4_4_ | (uint)!bVar65 * auVar95._4_4_;
            bVar65 = (bool)((byte)(uVar57 >> 2) & 1);
            uVar143 = (uint)bVar65 * auVar82._8_4_ | (uint)!bVar65 * auVar95._8_4_;
            bVar65 = (bool)((byte)(uVar57 >> 3) & 1);
            uVar144 = (uint)bVar65 * auVar82._12_4_ | (uint)!bVar65 * auVar95._12_4_;
            bVar65 = (bool)((byte)(uVar57 >> 4) & 1);
            uVar145 = (uint)bVar65 * auVar82._16_4_ | (uint)!bVar65 * auVar95._16_4_;
            bVar65 = (bool)((byte)(uVar57 >> 5) & 1);
            uVar146 = (uint)bVar65 * auVar82._20_4_ | (uint)!bVar65 * auVar95._20_4_;
            bVar65 = (bool)((byte)(uVar57 >> 6) & 1);
            uVar147 = (uint)bVar65 * auVar82._24_4_ | (uint)!bVar65 * auVar95._24_4_;
            bVar65 = SUB81(uVar57 >> 7,0);
            uVar148 = (uint)bVar65 * auVar82._28_4_ | (uint)!bVar65 * auVar95._28_4_;
            auVar128._0_4_ = (bVar56 & 1) * uVar68 | !(bool)(bVar56 & 1) * auVar128._0_4_;
            bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar128._4_4_ = bVar65 * uVar142 | !bVar65 * auVar128._4_4_;
            bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar128._8_4_ = bVar65 * uVar143 | !bVar65 * auVar128._8_4_;
            bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar128._12_4_ = bVar65 * uVar144 | !bVar65 * auVar128._12_4_;
            bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
            auVar128._16_4_ = bVar65 * uVar145 | !bVar65 * auVar128._16_4_;
            bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
            auVar128._20_4_ = bVar65 * uVar146 | !bVar65 * auVar128._20_4_;
            bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
            auVar128._24_4_ = bVar65 * uVar147 | !bVar65 * auVar128._24_4_;
            bVar65 = SUB81(uVar67 >> 7,0);
            auVar128._28_4_ = bVar65 * uVar148 | !bVar65 * auVar128._28_4_;
            auVar82 = vblendmps_avx512vl(auVar237,auVar248);
            bVar65 = (bool)((byte)(uVar57 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar57 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar57 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar57 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar57 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar57 >> 6) & 1);
            bVar11 = SUB81(uVar57 >> 7,0);
            auVar129._0_4_ =
                 (uint)(bVar56 & 1) *
                 ((uint)(bVar58 & 1) * auVar82._0_4_ | !(bool)(bVar58 & 1) * uVar68) |
                 !(bool)(bVar56 & 1) * auVar129._0_4_;
            bVar5 = (bool)((byte)(uVar67 >> 1) & 1);
            auVar129._4_4_ =
                 (uint)bVar5 * ((uint)bVar65 * auVar82._4_4_ | !bVar65 * uVar142) |
                 !bVar5 * auVar129._4_4_;
            bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
            auVar129._8_4_ =
                 (uint)bVar65 * ((uint)bVar6 * auVar82._8_4_ | !bVar6 * uVar143) |
                 !bVar65 * auVar129._8_4_;
            bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
            auVar129._12_4_ =
                 (uint)bVar65 * ((uint)bVar7 * auVar82._12_4_ | !bVar7 * uVar144) |
                 !bVar65 * auVar129._12_4_;
            bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
            auVar129._16_4_ =
                 (uint)bVar65 * ((uint)bVar8 * auVar82._16_4_ | !bVar8 * uVar145) |
                 !bVar65 * auVar129._16_4_;
            bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
            auVar129._20_4_ =
                 (uint)bVar65 * ((uint)bVar9 * auVar82._20_4_ | !bVar9 * uVar146) |
                 !bVar65 * auVar129._20_4_;
            bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
            auVar129._24_4_ =
                 (uint)bVar65 * ((uint)bVar10 * auVar82._24_4_ | !bVar10 * uVar147) |
                 !bVar65 * auVar129._24_4_;
            bVar65 = SUB81(uVar67 >> 7,0);
            auVar129._28_4_ =
                 (uint)bVar65 * ((uint)bVar11 * auVar82._28_4_ | !bVar11 * uVar148) |
                 !bVar65 * auVar129._28_4_;
            bVar59 = (~bVar56 | bVar58) & bVar59;
          }
        }
        auVar82 = vmulps_avx512vl(local_680,auVar94);
        auVar82 = vfmadd231ps_avx512vl(auVar82,auVar83,auVar79);
        auVar82 = vfmadd231ps_avx512vl(auVar82,auVar84,auVar96);
        _local_500 = _local_7e0;
        local_4e0 = vminps_avx(local_640,auVar128);
        vandps_avx512vl(auVar82,auVar107);
        _local_740 = vmaxps_avx(_local_7e0,auVar129);
        _local_660 = _local_740;
        auVar165._8_4_ = 0x3e99999a;
        auVar165._0_8_ = 0x3e99999a3e99999a;
        auVar165._12_4_ = 0x3e99999a;
        auVar165._16_4_ = 0x3e99999a;
        auVar165._20_4_ = 0x3e99999a;
        auVar165._24_4_ = 0x3e99999a;
        auVar165._28_4_ = 0x3e99999a;
        uVar14 = vcmpps_avx512vl(auVar82,auVar165,1);
        uVar16 = vcmpps_avx512vl(_local_7e0,local_4e0,2);
        bVar56 = (byte)uVar16 & bVar53;
        uVar15 = vcmpps_avx512vl(_local_740,local_640,2);
        auVar134._32_32_ = auVar81;
        auVar141 = auVar134;
        if ((bVar53 & ((byte)uVar15 | (byte)uVar16)) != 0) {
          auVar82 = vmulps_avx512vl(local_680,auVar244._0_32_);
          auVar82 = vfmadd213ps_avx512vl(auVar97,auVar83,auVar82);
          auVar82 = vfmadd213ps_avx512vl(auVar80,auVar84,auVar82);
          vandps_avx512vl(auVar82,auVar107);
          uVar16 = vcmpps_avx512vl(auVar82,auVar165,1);
          bVar58 = (byte)uVar16 | ~bVar59;
          auVar166._8_4_ = 2;
          auVar166._0_8_ = 0x200000002;
          auVar166._12_4_ = 2;
          auVar166._16_4_ = 2;
          auVar166._20_4_ = 2;
          auVar166._24_4_ = 2;
          auVar166._28_4_ = 2;
          auVar27._8_4_ = 3;
          auVar27._0_8_ = 0x300000003;
          auVar27._12_4_ = 3;
          auVar27._16_4_ = 3;
          auVar27._20_4_ = 3;
          auVar27._24_4_ = 3;
          auVar27._28_4_ = 3;
          auVar82 = vpblendmd_avx512vl(auVar166,auVar27);
          local_620._0_4_ = (uint)(bVar58 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar58 & 1) * 2;
          bVar65 = (bool)(bVar58 >> 1 & 1);
          local_620._4_4_ = (uint)bVar65 * auVar82._4_4_ | (uint)!bVar65 * 2;
          bVar65 = (bool)(bVar58 >> 2 & 1);
          local_620._8_4_ = (uint)bVar65 * auVar82._8_4_ | (uint)!bVar65 * 2;
          bVar65 = (bool)(bVar58 >> 3 & 1);
          local_620._12_4_ = (uint)bVar65 * auVar82._12_4_ | (uint)!bVar65 * 2;
          bVar65 = (bool)(bVar58 >> 4 & 1);
          local_620._16_4_ = (uint)bVar65 * auVar82._16_4_ | (uint)!bVar65 * 2;
          bVar65 = (bool)(bVar58 >> 5 & 1);
          local_620._20_4_ = (uint)bVar65 * auVar82._20_4_ | (uint)!bVar65 * 2;
          bVar65 = (bool)(bVar58 >> 6 & 1);
          local_620._24_4_ = (uint)bVar65 * auVar82._24_4_ | (uint)!bVar65 * 2;
          local_620._28_4_ = (uint)(bVar58 >> 7) * auVar82._28_4_ | (uint)!(bool)(bVar58 >> 7) * 2;
          auVar218._0_32_ = vpbroadcastd_avx512vl();
          auVar218._32_32_ = auVar81;
          local_6c0 = auVar218._0_32_;
          uVar16 = vpcmpd_avx512vl(auVar218._0_32_,local_620,5);
          bVar58 = (byte)uVar16 & bVar56;
          if (bVar58 == 0) {
            auVar220._8_4_ = 0x7fffffff;
            auVar220._0_8_ = 0x7fffffff7fffffff;
            auVar220._12_4_ = 0x7fffffff;
          }
          else {
            auVar71 = vminps_avx(local_8c0._0_16_,local_900._0_16_);
            auVar69 = vmaxps_avx(local_8c0._0_16_,local_900._0_16_);
            auVar78 = vminps_avx(local_8e0._0_16_,local_920._0_16_);
            auVar70 = vminps_avx(auVar71,auVar78);
            auVar71 = vmaxps_avx(local_8e0._0_16_,local_920._0_16_);
            auVar78 = vmaxps_avx(auVar69,auVar71);
            auVar192._8_4_ = 0x7fffffff;
            auVar192._0_8_ = 0x7fffffff7fffffff;
            auVar192._12_4_ = 0x7fffffff;
            auVar69 = vandps_avx(auVar70,auVar192);
            auVar71 = vandps_avx(auVar78,auVar192);
            auVar69 = vmaxps_avx(auVar69,auVar71);
            auVar71 = vmovshdup_avx(auVar69);
            auVar71 = vmaxss_avx(auVar71,auVar69);
            auVar69 = vshufpd_avx(auVar69,auVar69,1);
            auVar69 = vmaxss_avx(auVar69,auVar71);
            fVar234 = auVar69._0_4_ * 1.9073486e-06;
            local_880 = vshufps_avx(auVar78,auVar78,0xff);
            local_720 = (float)local_7e0._0_4_ + (float)local_7a0._0_4_;
            fStack_71c = (float)local_7e0._4_4_ + (float)local_7a0._4_4_;
            fStack_718 = fStack_7d8 + fStack_798;
            fStack_714 = fStack_7d4 + fStack_794;
            fStack_710 = fStack_7d0 + fStack_790;
            fStack_70c = fStack_7cc + fStack_78c;
            fStack_708 = fStack_7c8 + fStack_788;
            fStack_704 = fStack_7c4 + fStack_784;
            do {
              auVar167._8_4_ = 0x7f800000;
              auVar167._0_8_ = 0x7f8000007f800000;
              auVar167._12_4_ = 0x7f800000;
              auVar167._16_4_ = 0x7f800000;
              auVar167._20_4_ = 0x7f800000;
              auVar167._24_4_ = 0x7f800000;
              auVar167._28_4_ = 0x7f800000;
              auVar81 = vblendmps_avx512vl(auVar167,_local_7e0);
              auVar130._0_4_ =
                   (uint)(bVar58 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar58 & 1) * 0x7f800000;
              bVar65 = (bool)(bVar58 >> 1 & 1);
              auVar130._4_4_ = (uint)bVar65 * auVar81._4_4_ | (uint)!bVar65 * 0x7f800000;
              bVar65 = (bool)(bVar58 >> 2 & 1);
              auVar130._8_4_ = (uint)bVar65 * auVar81._8_4_ | (uint)!bVar65 * 0x7f800000;
              bVar65 = (bool)(bVar58 >> 3 & 1);
              auVar130._12_4_ = (uint)bVar65 * auVar81._12_4_ | (uint)!bVar65 * 0x7f800000;
              bVar65 = (bool)(bVar58 >> 4 & 1);
              auVar130._16_4_ = (uint)bVar65 * auVar81._16_4_ | (uint)!bVar65 * 0x7f800000;
              bVar65 = (bool)(bVar58 >> 5 & 1);
              auVar130._20_4_ = (uint)bVar65 * auVar81._20_4_ | (uint)!bVar65 * 0x7f800000;
              auVar130._24_4_ =
                   (uint)(bVar58 >> 6) * auVar81._24_4_ | (uint)!(bool)(bVar58 >> 6) * 0x7f800000;
              auVar130._28_4_ = 0x7f800000;
              auVar218._0_32_ = auVar130;
              auVar81 = vshufps_avx(auVar130,auVar130,0xb1);
              auVar81 = vminps_avx(auVar130,auVar81);
              auVar82 = vshufpd_avx(auVar81,auVar81,5);
              auVar81 = vminps_avx(auVar81,auVar82);
              auVar82 = vpermpd_avx2(auVar81,0x4e);
              auVar81 = vminps_avx(auVar81,auVar82);
              uVar16 = vcmpps_avx512vl(auVar130,auVar81,0);
              bVar54 = (byte)uVar16 & bVar58;
              bVar63 = bVar58;
              if (bVar54 != 0) {
                bVar63 = bVar54;
              }
              iVar17 = 0;
              for (uVar68 = (uint)bVar63; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              bVar63 = '\x01' << ((byte)iVar17 & 0x1f);
              uVar68 = *(uint *)(local_6e0 + (uint)(iVar17 << 2));
              uVar142 = *(uint *)(local_500 + (uint)(iVar17 << 2));
              fVar228 = auVar13._0_4_;
              if ((float)local_940._0_4_ < 0.0) {
                fVar228 = sqrtf((float)local_940._0_4_);
              }
              auVar244 = ZEXT464(uVar68);
              auVar241 = ZEXT464(uVar142);
              bVar54 = ~bVar63;
              lVar64 = 5;
              do {
                auVar81 = auVar218._32_32_;
                fVar229 = auVar241._0_4_;
                auVar152._4_4_ = fVar229;
                auVar152._0_4_ = fVar229;
                auVar152._8_4_ = fVar229;
                auVar152._12_4_ = fVar229;
                auVar69 = vfmadd132ps_fma(auVar152,ZEXT816(0) << 0x40,local_930);
                fVar238 = auVar244._0_4_;
                fVar207 = 1.0 - fVar238;
                auVar72 = SUB6416(ZEXT464(0x40400000),0);
                auVar236 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar243 = auVar244._0_16_;
                auVar78 = vfmadd213ss_fma(auVar72,auVar243,auVar236);
                auVar71 = vfmadd213ss_fma(auVar78,ZEXT416((uint)(fVar238 * fVar238)),
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar70 = vfmadd213ss_fma(auVar72,ZEXT416((uint)fVar207),auVar236);
                auVar70 = vfmadd213ss_fma(auVar70,ZEXT416((uint)(fVar207 * fVar207)),
                                          SUB6416(ZEXT464(0x40000000),0));
                fVar230 = fVar207 * fVar207 * -fVar238 * 0.5;
                fVar231 = auVar71._0_4_ * 0.5;
                fVar232 = auVar70._0_4_ * 0.5;
                fVar233 = fVar238 * fVar238 * -fVar207 * 0.5;
                auVar208._0_4_ = fVar233 * (float)local_920._0_4_;
                auVar208._4_4_ = fVar233 * (float)local_920._4_4_;
                auVar208._8_4_ = fVar233 * fStack_918;
                auVar208._12_4_ = fVar233 * fStack_914;
                auVar219._4_4_ = fVar232;
                auVar219._0_4_ = fVar232;
                auVar219._8_4_ = fVar232;
                auVar219._12_4_ = fVar232;
                auVar71 = vfmadd132ps_fma(auVar219,auVar208,local_8e0._0_16_);
                auVar193._4_4_ = fVar231;
                auVar193._0_4_ = fVar231;
                auVar193._8_4_ = fVar231;
                auVar193._12_4_ = fVar231;
                auVar71 = vfmadd132ps_fma(auVar193,auVar71,local_900._0_16_);
                auVar209._4_4_ = fVar230;
                auVar209._0_4_ = fVar230;
                auVar209._8_4_ = fVar230;
                auVar209._12_4_ = fVar230;
                auVar71 = vfmadd132ps_fma(auVar209,auVar71,local_8c0._0_16_);
                local_810 = vfmadd231ss_fma(auVar236,auVar243,ZEXT416(0x41100000));
                local_820 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar243,
                                            ZEXT416(0x40800000));
                local_830 = vfmadd213ss_fma(auVar72,auVar243,ZEXT416(0xbf800000));
                local_7c0._0_16_ = auVar71;
                auVar71 = vsubps_avx(auVar69,auVar71);
                auVar69 = vdpps_avx(auVar71,auVar71,0x7f);
                fVar230 = auVar69._0_4_;
                if (fVar230 < 0.0) {
                  auVar244._0_4_ = sqrtf(fVar230);
                  auVar244._4_60_ = extraout_var;
                  auVar78 = ZEXT416(auVar78._0_4_);
                  auVar70 = auVar244._0_16_;
                }
                else {
                  auVar70 = vsqrtss_avx(auVar69,auVar69);
                }
                auVar73 = vfnmadd231ss_fma(ZEXT416((uint)(fVar238 * (fVar207 + fVar207))),
                                           ZEXT416((uint)fVar207),ZEXT416((uint)fVar207));
                auVar78 = vfmadd213ss_fma(auVar78,ZEXT416((uint)(fVar238 + fVar238)),
                                          ZEXT416((uint)(fVar238 * fVar238 * 3.0)));
                auVar236 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar243,
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * fVar207 * -3.0)),
                                          ZEXT416((uint)(fVar207 + fVar207)),auVar236);
                auVar236 = vfmadd213ss_fma(ZEXT416((uint)(fVar207 * -2.0)),auVar243,
                                           ZEXT416((uint)(fVar238 * fVar238)));
                fVar231 = auVar73._0_4_ * 0.5;
                fVar232 = auVar78._0_4_ * 0.5;
                fVar233 = auVar72._0_4_ * 0.5;
                fVar207 = auVar236._0_4_ * 0.5;
                auVar210._0_4_ = fVar207 * (float)local_920._0_4_;
                auVar210._4_4_ = fVar207 * (float)local_920._4_4_;
                auVar210._8_4_ = fVar207 * fStack_918;
                auVar210._12_4_ = fVar207 * fStack_914;
                auVar194._4_4_ = fVar233;
                auVar194._0_4_ = fVar233;
                auVar194._8_4_ = fVar233;
                auVar194._12_4_ = fVar233;
                auVar78 = vfmadd132ps_fma(auVar194,auVar210,local_8e0._0_16_);
                auVar173._4_4_ = fVar232;
                auVar173._0_4_ = fVar232;
                auVar173._8_4_ = fVar232;
                auVar173._12_4_ = fVar232;
                auVar78 = vfmadd132ps_fma(auVar173,auVar78,local_900._0_16_);
                auVar250._4_4_ = fVar231;
                auVar250._0_4_ = fVar231;
                auVar250._8_4_ = fVar231;
                auVar250._12_4_ = fVar231;
                auVar236 = vfmadd132ps_fma(auVar250,auVar78,local_8c0._0_16_);
                auVar78 = vdpps_avx(auVar236,auVar236,0x7f);
                auVar48._12_4_ = 0;
                auVar48._0_12_ = ZEXT812(0);
                fVar231 = auVar78._0_4_;
                auVar72 = vrsqrt14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar231));
                fVar232 = auVar72._0_4_;
                auVar73 = vrcp14ss_avx512f(auVar48 << 0x20,ZEXT416((uint)fVar231));
                auVar18._8_4_ = 0x80000000;
                auVar18._0_8_ = 0x8000000080000000;
                auVar18._12_4_ = 0x80000000;
                auVar74 = vxorps_avx512vl(auVar78,auVar18);
                auVar72 = vfnmadd213ss_fma(auVar73,auVar78,SUB6416(ZEXT464(0x40000000),0));
                uVar68 = auVar70._0_4_;
                if (fVar231 < auVar74._0_4_) {
                  fVar233 = sqrtf(fVar231);
                  auVar70 = ZEXT416(uVar68);
                }
                else {
                  auVar78 = vsqrtss_avx(auVar78,auVar78);
                  fVar233 = auVar78._0_4_;
                }
                fVar232 = fVar232 * 1.5 + fVar231 * -0.5 * fVar232 * fVar232 * fVar232;
                auVar153._0_4_ = auVar236._0_4_ * fVar232;
                auVar153._4_4_ = auVar236._4_4_ * fVar232;
                auVar153._8_4_ = auVar236._8_4_ * fVar232;
                auVar153._12_4_ = auVar236._12_4_ * fVar232;
                auVar78 = vdpps_avx(auVar71,auVar153,0x7f);
                fVar235 = auVar70._0_4_;
                auVar154._0_4_ = auVar78._0_4_ * auVar78._0_4_;
                auVar154._4_4_ = auVar78._4_4_ * auVar78._4_4_;
                auVar154._8_4_ = auVar78._8_4_ * auVar78._8_4_;
                auVar154._12_4_ = auVar78._12_4_ * auVar78._12_4_;
                auVar75 = vsubps_avx512vl(auVar69,auVar154);
                fVar207 = auVar75._0_4_;
                auVar174._4_12_ = ZEXT812(0) << 0x20;
                auVar174._0_4_ = fVar207;
                auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
                auVar76 = vmulss_avx512f(auVar74,ZEXT416(0x3fc00000));
                if (fVar207 < 0.0) {
                  local_860 = fVar232;
                  fStack_85c = fVar232;
                  fStack_858 = fVar232;
                  fStack_854 = fVar232;
                  local_850 = auVar74;
                  local_840 = auVar78;
                  fVar151 = sqrtf(fVar207);
                  auVar76 = ZEXT416(auVar76._0_4_);
                  auVar70 = ZEXT416(uVar68);
                  auVar78 = local_840;
                  auVar74 = local_850;
                  fVar232 = local_860;
                  fVar239 = fStack_85c;
                  fVar240 = fStack_858;
                  fVar242 = fStack_854;
                }
                else {
                  auVar75 = vsqrtss_avx(auVar75,auVar75);
                  fVar151 = auVar75._0_4_;
                  fVar239 = fVar232;
                  fVar240 = fVar232;
                  fVar242 = fVar232;
                }
                auVar252 = ZEXT1664(auVar236);
                auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar253 = ZEXT3264(auVar82);
                auVar249._32_32_ = auVar81;
                auVar249._0_32_ = auVar172._0_32_;
                auVar175._0_4_ = (float)local_830._0_4_ * (float)local_920._0_4_;
                auVar175._4_4_ = (float)local_830._0_4_ * (float)local_920._4_4_;
                auVar175._8_4_ = (float)local_830._0_4_ * fStack_918;
                auVar175._12_4_ = (float)local_830._0_4_ * fStack_914;
                auVar195._4_4_ = local_820._0_4_;
                auVar195._0_4_ = local_820._0_4_;
                auVar195._8_4_ = local_820._0_4_;
                auVar195._12_4_ = local_820._0_4_;
                auVar75 = vfmadd132ps_fma(auVar195,auVar175,local_8e0._0_16_);
                auVar176._4_4_ = local_810._0_4_;
                auVar176._0_4_ = local_810._0_4_;
                auVar176._8_4_ = local_810._0_4_;
                auVar176._12_4_ = local_810._0_4_;
                auVar75 = vfmadd132ps_fma(auVar176,auVar75,local_900._0_16_);
                auVar243 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar243,
                                           ZEXT416(0x40000000));
                auVar196._0_4_ = auVar243._0_4_;
                auVar196._4_4_ = auVar196._0_4_;
                auVar196._8_4_ = auVar196._0_4_;
                auVar196._12_4_ = auVar196._0_4_;
                auVar243 = vfmadd132ps_fma(auVar196,auVar75,local_8c0._0_16_);
                auVar177._0_4_ = auVar243._0_4_ * fVar231;
                auVar177._4_4_ = auVar243._4_4_ * fVar231;
                auVar177._8_4_ = auVar243._8_4_ * fVar231;
                auVar177._12_4_ = auVar243._12_4_ * fVar231;
                auVar243 = vdpps_avx(auVar236,auVar243,0x7f);
                fVar231 = auVar243._0_4_;
                auVar197._0_4_ = auVar236._0_4_ * fVar231;
                auVar197._4_4_ = auVar236._4_4_ * fVar231;
                auVar197._8_4_ = auVar236._8_4_ * fVar231;
                auVar197._12_4_ = auVar236._12_4_ * fVar231;
                auVar243 = vsubps_avx(auVar177,auVar197);
                local_bd0 = auVar73._0_4_;
                local_bd0 = auVar72._0_4_ * local_bd0;
                auVar73 = vmaxss_avx(ZEXT416((uint)fVar234),
                                     ZEXT416((uint)(fVar229 * fVar228 * 1.9073486e-06)));
                auVar19._8_4_ = 0x80000000;
                auVar19._0_8_ = 0x8000000080000000;
                auVar19._12_4_ = 0x80000000;
                auVar218._16_48_ = auVar249._16_48_;
                auVar77 = vxorps_avx512vl(auVar236,auVar19);
                auVar198._0_4_ = fVar232 * auVar243._0_4_ * local_bd0;
                auVar198._4_4_ = fVar239 * auVar243._4_4_ * local_bd0;
                auVar198._8_4_ = fVar240 * auVar243._8_4_ * local_bd0;
                auVar198._12_4_ = fVar242 * auVar243._12_4_ * local_bd0;
                auVar249 = ZEXT1664(auVar153);
                auVar72 = vdpps_avx(auVar77,auVar153,0x7f);
                auVar243 = vfmadd213ss_fma(auVar70,ZEXT416((uint)fVar234),auVar73);
                auVar70 = vdpps_avx(auVar71,auVar198,0x7f);
                auVar75 = vfmadd213ss_fma(ZEXT416((uint)(fVar235 + 1.0)),
                                          ZEXT416((uint)(fVar234 / fVar233)),auVar243);
                fVar231 = auVar72._0_4_ + auVar70._0_4_;
                auVar70 = vdpps_avx(local_930,auVar153,0x7f);
                auVar72 = vdpps_avx(auVar71,auVar77,0x7f);
                fVar232 = auVar74._0_4_;
                auVar218._0_16_ =
                     vaddss_avx512f(auVar76,ZEXT416((uint)(fVar232 * fVar207 * -0.5 *
                                                          fVar232 * fVar232)));
                auVar243 = vdpps_avx(auVar71,local_930,0x7f);
                auVar74 = vfnmadd231ss_fma(auVar72,auVar78,ZEXT416((uint)fVar231));
                auVar76 = vfnmadd231ss_fma(auVar243,auVar78,auVar70);
                auVar72 = vpermilps_avx(local_7c0._0_16_,0xff);
                fVar151 = fVar151 - auVar72._0_4_;
                auVar72 = vshufps_avx(auVar236,auVar236,0xff);
                auVar243 = vfmsub213ss_fma(auVar74,auVar218._0_16_,auVar72);
                fVar232 = auVar76._0_4_ * auVar218._0_4_;
                auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar70._0_4_ * auVar243._0_4_)),
                                          ZEXT416((uint)fVar231),ZEXT416((uint)fVar232));
                fVar233 = auVar74._0_4_;
                fVar238 = fVar238 - (auVar78._0_4_ * (fVar232 / fVar233) -
                                    fVar151 * (auVar70._0_4_ / fVar233));
                auVar244 = ZEXT464((uint)fVar238);
                fVar229 = fVar229 - (fVar151 * (fVar231 / fVar233) -
                                    auVar78._0_4_ * (auVar243._0_4_ / fVar233));
                auVar241 = ZEXT464((uint)fVar229);
                auVar220._8_4_ = 0x7fffffff;
                auVar220._0_8_ = 0x7fffffff7fffffff;
                auVar220._12_4_ = 0x7fffffff;
                auVar78 = vandps_avx(auVar78,auVar220);
                bVar65 = true;
                if (auVar78._0_4_ < auVar75._0_4_) {
                  auVar70 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ + auVar73._0_4_)),local_880
                                            ,ZEXT416(0x36000000));
                  auVar78 = vandps_avx(ZEXT416((uint)fVar151),auVar220);
                  if (auVar78._0_4_ < auVar70._0_4_) {
                    fVar229 = fVar229 + (float)local_870._0_4_;
                    auVar241 = ZEXT464((uint)fVar229);
                    if ((((fVar149 <= fVar229) &&
                         (fVar231 = *(float *)(ray + k * 4 + 0x200), fVar229 <= fVar231)) &&
                        (0.0 <= fVar238)) && (fVar238 <= 1.0)) {
                      auVar136._16_48_ = auVar218._16_48_;
                      auVar136._0_16_ = ZEXT816(0) << 0x20;
                      auVar135._4_60_ = auVar136._4_60_;
                      auVar135._0_4_ = fVar230;
                      auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar135._0_16_);
                      fVar230 = auVar78._0_4_;
                      auVar218._0_16_ = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
                      pGVar3 = (context->scene->geometries).items[uVar60].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          bVar63 = true;
                        }
                        else {
                          fVar230 = fVar230 * 1.5 + auVar218._0_4_ * fVar230 * fVar230 * fVar230;
                          auVar178._0_4_ = auVar71._0_4_ * fVar230;
                          auVar178._4_4_ = auVar71._4_4_ * fVar230;
                          auVar178._8_4_ = auVar71._8_4_ * fVar230;
                          auVar178._12_4_ = auVar71._12_4_ * fVar230;
                          auVar70 = vfmadd213ps_fma(auVar72,auVar178,auVar236);
                          auVar69 = vshufps_avx(auVar178,auVar178,0xc9);
                          auVar71 = vshufps_avx(auVar236,auVar236,0xc9);
                          auVar179._0_4_ = auVar178._0_4_ * auVar71._0_4_;
                          auVar179._4_4_ = auVar178._4_4_ * auVar71._4_4_;
                          auVar179._8_4_ = auVar178._8_4_ * auVar71._8_4_;
                          auVar179._12_4_ = auVar178._12_4_ * auVar71._12_4_;
                          auVar78 = vfmsub231ps_fma(auVar179,auVar236,auVar69);
                          auVar69 = vshufps_avx(auVar78,auVar78,0xc9);
                          auVar71 = vshufps_avx(auVar70,auVar70,0xc9);
                          auVar78 = vshufps_avx(auVar78,auVar78,0xd2);
                          auVar155._0_4_ = auVar70._0_4_ * auVar78._0_4_;
                          auVar155._4_4_ = auVar70._4_4_ * auVar78._4_4_;
                          auVar155._8_4_ = auVar70._8_4_ * auVar78._8_4_;
                          auVar155._12_4_ = auVar70._12_4_ * auVar78._12_4_;
                          auVar69 = vfmsub231ps_fma(auVar155,auVar69,auVar71);
                          auVar71 = ZEXT416((uint)fVar238);
                          local_340 = vbroadcastss_avx512f(auVar71);
                          auVar218 = vbroadcastss_avx512f(ZEXT416(1));
                          auVar218 = vpermps_avx512f(auVar218,ZEXT1664(auVar69));
                          auVar140 = vbroadcastss_avx512f(ZEXT416(2));
                          local_3c0 = vpermps_avx512f(auVar140,ZEXT1664(auVar69));
                          local_380 = vbroadcastss_avx512f(auVar69);
                          local_400[0] = (RTCHitN)auVar218[0];
                          local_400[1] = (RTCHitN)auVar218[1];
                          local_400[2] = (RTCHitN)auVar218[2];
                          local_400[3] = (RTCHitN)auVar218[3];
                          local_400[4] = (RTCHitN)auVar218[4];
                          local_400[5] = (RTCHitN)auVar218[5];
                          local_400[6] = (RTCHitN)auVar218[6];
                          local_400[7] = (RTCHitN)auVar218[7];
                          local_400[8] = (RTCHitN)auVar218[8];
                          local_400[9] = (RTCHitN)auVar218[9];
                          local_400[10] = (RTCHitN)auVar218[10];
                          local_400[0xb] = (RTCHitN)auVar218[0xb];
                          local_400[0xc] = (RTCHitN)auVar218[0xc];
                          local_400[0xd] = (RTCHitN)auVar218[0xd];
                          local_400[0xe] = (RTCHitN)auVar218[0xe];
                          local_400[0xf] = (RTCHitN)auVar218[0xf];
                          local_400[0x10] = (RTCHitN)auVar218[0x10];
                          local_400[0x11] = (RTCHitN)auVar218[0x11];
                          local_400[0x12] = (RTCHitN)auVar218[0x12];
                          local_400[0x13] = (RTCHitN)auVar218[0x13];
                          local_400[0x14] = (RTCHitN)auVar218[0x14];
                          local_400[0x15] = (RTCHitN)auVar218[0x15];
                          local_400[0x16] = (RTCHitN)auVar218[0x16];
                          local_400[0x17] = (RTCHitN)auVar218[0x17];
                          local_400[0x18] = (RTCHitN)auVar218[0x18];
                          local_400[0x19] = (RTCHitN)auVar218[0x19];
                          local_400[0x1a] = (RTCHitN)auVar218[0x1a];
                          local_400[0x1b] = (RTCHitN)auVar218[0x1b];
                          local_400[0x1c] = (RTCHitN)auVar218[0x1c];
                          local_400[0x1d] = (RTCHitN)auVar218[0x1d];
                          local_400[0x1e] = (RTCHitN)auVar218[0x1e];
                          local_400[0x1f] = (RTCHitN)auVar218[0x1f];
                          local_400[0x20] = (RTCHitN)auVar218[0x20];
                          local_400[0x21] = (RTCHitN)auVar218[0x21];
                          local_400[0x22] = (RTCHitN)auVar218[0x22];
                          local_400[0x23] = (RTCHitN)auVar218[0x23];
                          local_400[0x24] = (RTCHitN)auVar218[0x24];
                          local_400[0x25] = (RTCHitN)auVar218[0x25];
                          local_400[0x26] = (RTCHitN)auVar218[0x26];
                          local_400[0x27] = (RTCHitN)auVar218[0x27];
                          local_400[0x28] = (RTCHitN)auVar218[0x28];
                          local_400[0x29] = (RTCHitN)auVar218[0x29];
                          local_400[0x2a] = (RTCHitN)auVar218[0x2a];
                          local_400[0x2b] = (RTCHitN)auVar218[0x2b];
                          local_400[0x2c] = (RTCHitN)auVar218[0x2c];
                          local_400[0x2d] = (RTCHitN)auVar218[0x2d];
                          local_400[0x2e] = (RTCHitN)auVar218[0x2e];
                          local_400[0x2f] = (RTCHitN)auVar218[0x2f];
                          local_400[0x30] = (RTCHitN)auVar218[0x30];
                          local_400[0x31] = (RTCHitN)auVar218[0x31];
                          local_400[0x32] = (RTCHitN)auVar218[0x32];
                          local_400[0x33] = (RTCHitN)auVar218[0x33];
                          local_400[0x34] = (RTCHitN)auVar218[0x34];
                          local_400[0x35] = (RTCHitN)auVar218[0x35];
                          local_400[0x36] = (RTCHitN)auVar218[0x36];
                          local_400[0x37] = (RTCHitN)auVar218[0x37];
                          local_400[0x38] = (RTCHitN)auVar218[0x38];
                          local_400[0x39] = (RTCHitN)auVar218[0x39];
                          local_400[0x3a] = (RTCHitN)auVar218[0x3a];
                          local_400[0x3b] = (RTCHitN)auVar218[0x3b];
                          local_400[0x3c] = (RTCHitN)auVar218[0x3c];
                          local_400[0x3d] = (RTCHitN)auVar218[0x3d];
                          local_400[0x3e] = (RTCHitN)auVar218[0x3e];
                          local_400[0x3f] = (RTCHitN)auVar218[0x3f];
                          local_300 = 0;
                          uStack_2f8 = 0;
                          uStack_2f0 = 0;
                          uStack_2e8 = 0;
                          uStack_2e0 = 0;
                          uStack_2d8 = 0;
                          uStack_2d0 = 0;
                          uStack_2c8 = 0;
                          local_2c0 = local_440._0_8_;
                          uStack_2b8 = local_440._8_8_;
                          uStack_2b0 = local_440._16_8_;
                          uStack_2a8 = local_440._24_8_;
                          uStack_2a0 = local_440._32_8_;
                          uStack_298 = local_440._40_8_;
                          uStack_290 = local_440._48_8_;
                          uStack_288 = local_440._56_8_;
                          auVar218 = vmovdqa64_avx512f(local_480);
                          local_280 = vmovdqa64_avx512f(auVar218);
                          vpcmpeqd_avx2(auVar218._0_32_,auVar218._0_32_);
                          local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                          local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                          *(float *)(ray + k * 4 + 0x200) = fVar229;
                          local_780 = local_4c0;
                          local_970.valid = (int *)local_780;
                          local_970.geometryUserPtr = pGVar3->userPtr;
                          local_970.context = context->user;
                          local_970.hit = local_400;
                          local_970.N = 0x10;
                          local_970.ray = (RTCRayN *)ray;
                          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar249 = ZEXT1664(auVar153);
                            auVar252 = ZEXT1664(auVar236);
                            (*pGVar3->occlusionFilterN)(&local_970);
                            auVar241 = ZEXT1664(ZEXT416((uint)fVar229));
                            auVar244 = ZEXT1664(auVar71);
                            auVar220._8_4_ = 0x7fffffff;
                            auVar220._0_8_ = 0x7fffffff7fffffff;
                            auVar220._12_4_ = 0x7fffffff;
                            auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar253 = ZEXT3264(auVar81);
                          }
                          auVar218 = vmovdqa64_avx512f(local_780);
                          uVar16 = vptestmd_avx512f(auVar218,auVar218);
                          if ((short)uVar16 == 0) {
                            bVar63 = false;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar249 = ZEXT1664(auVar249._0_16_);
                              auVar252 = ZEXT1664(auVar252._0_16_);
                              (*p_Var4)(&local_970);
                              auVar241 = ZEXT1664(ZEXT416((uint)fVar229));
                              auVar244 = ZEXT1664(auVar71);
                              auVar220._8_4_ = 0x7fffffff;
                              auVar220._0_8_ = 0x7fffffff7fffffff;
                              auVar220._12_4_ = 0x7fffffff;
                              auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar253 = ZEXT3264(auVar81);
                            }
                            auVar218 = vmovdqa64_avx512f(local_780);
                            uVar67 = vptestmd_avx512f(auVar218,auVar218);
                            auVar140 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                            bVar65 = (bool)((byte)uVar67 & 1);
                            auVar218._0_4_ =
                                 (uint)bVar65 * auVar140._0_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x200);
                            bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
                            auVar218._4_4_ =
                                 (uint)bVar65 * auVar140._4_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x204);
                            bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
                            auVar218._8_4_ =
                                 (uint)bVar65 * auVar140._8_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x208);
                            bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
                            auVar218._12_4_ =
                                 (uint)bVar65 * auVar140._12_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x20c);
                            bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
                            auVar218._16_4_ =
                                 (uint)bVar65 * auVar140._16_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x210);
                            bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
                            auVar218._20_4_ =
                                 (uint)bVar65 * auVar140._20_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x214);
                            bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
                            auVar218._24_4_ =
                                 (uint)bVar65 * auVar140._24_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x218);
                            bVar65 = (bool)((byte)(uVar67 >> 7) & 1);
                            auVar218._28_4_ =
                                 (uint)bVar65 * auVar140._28_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x21c);
                            bVar65 = (bool)((byte)(uVar67 >> 8) & 1);
                            auVar218._32_4_ =
                                 (uint)bVar65 * auVar140._32_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x220);
                            bVar65 = (bool)((byte)(uVar67 >> 9) & 1);
                            auVar218._36_4_ =
                                 (uint)bVar65 * auVar140._36_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x224);
                            bVar65 = (bool)((byte)(uVar67 >> 10) & 1);
                            auVar218._40_4_ =
                                 (uint)bVar65 * auVar140._40_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x228);
                            bVar65 = (bool)((byte)(uVar67 >> 0xb) & 1);
                            auVar218._44_4_ =
                                 (uint)bVar65 * auVar140._44_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x22c);
                            bVar65 = (bool)((byte)(uVar67 >> 0xc) & 1);
                            auVar218._48_4_ =
                                 (uint)bVar65 * auVar140._48_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x230);
                            bVar65 = (bool)((byte)(uVar67 >> 0xd) & 1);
                            auVar218._52_4_ =
                                 (uint)bVar65 * auVar140._52_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x234);
                            bVar65 = (bool)((byte)(uVar67 >> 0xe) & 1);
                            auVar218._56_4_ =
                                 (uint)bVar65 * auVar140._56_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x238);
                            bVar65 = SUB81(uVar67 >> 0xf,0);
                            auVar218._60_4_ =
                                 (uint)bVar65 * auVar140._60_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x23c);
                            *(undefined1 (*) [64])(local_970.ray + 0x200) = auVar218;
                            bVar63 = (short)uVar67 != 0;
                          }
                          if ((bool)bVar63 == false) {
                            *(float *)(ray + k * 4 + 0x200) = fVar231;
                          }
                        }
                        bVar65 = false;
                        goto LAB_01db9ca3;
                      }
                    }
                    bVar65 = false;
                    bVar63 = 0;
                  }
                }
LAB_01db9ca3:
                auVar81 = auVar218._32_32_;
                if (!bVar65) goto LAB_01dba0b8;
                lVar64 = lVar64 + -1;
              } while (lVar64 != 0);
              bVar63 = 0;
LAB_01dba0b8:
              bVar62 = bVar62 | bVar63 & 1;
              auVar50._4_4_ = fStack_71c;
              auVar50._0_4_ = local_720;
              auVar50._8_4_ = fStack_718;
              auVar50._12_4_ = fStack_714;
              auVar50._16_4_ = fStack_710;
              auVar50._20_4_ = fStack_70c;
              auVar50._24_4_ = fStack_708;
              auVar50._28_4_ = fStack_704;
              uVar150 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar28._4_4_ = uVar150;
              auVar28._0_4_ = uVar150;
              auVar28._8_4_ = uVar150;
              auVar28._12_4_ = uVar150;
              auVar28._16_4_ = uVar150;
              auVar28._20_4_ = uVar150;
              auVar28._24_4_ = uVar150;
              auVar28._28_4_ = uVar150;
              uVar16 = vcmpps_avx512vl(auVar50,auVar28,2);
              bVar58 = bVar54 & bVar58 & (byte)uVar16;
            } while (bVar58 != 0);
          }
          auVar168._0_4_ = (float)local_7a0._0_4_ + (float)local_740._0_4_;
          auVar168._4_4_ = (float)local_7a0._4_4_ + (float)local_740._4_4_;
          auVar168._8_4_ = fStack_798 + fStack_738;
          auVar168._12_4_ = fStack_794 + fStack_734;
          auVar168._16_4_ = fStack_790 + fStack_730;
          auVar168._20_4_ = fStack_78c + fStack_72c;
          auVar168._24_4_ = fStack_788 + fStack_728;
          auVar168._28_4_ = fStack_784 + fStack_724;
          uVar150 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar29._4_4_ = uVar150;
          auVar29._0_4_ = uVar150;
          auVar29._8_4_ = uVar150;
          auVar29._12_4_ = uVar150;
          auVar29._16_4_ = uVar150;
          auVar29._20_4_ = uVar150;
          auVar29._24_4_ = uVar150;
          auVar29._28_4_ = uVar150;
          uVar16 = vcmpps_avx512vl(auVar168,auVar29,2);
          bVar59 = (byte)uVar14 | ~bVar59;
          bVar53 = (byte)uVar15 & bVar53 & (byte)uVar16;
          auVar169._8_4_ = 2;
          auVar169._0_8_ = 0x200000002;
          auVar169._12_4_ = 2;
          auVar169._16_4_ = 2;
          auVar169._20_4_ = 2;
          auVar169._24_4_ = 2;
          auVar169._28_4_ = 2;
          auVar30._8_4_ = 3;
          auVar30._0_8_ = 0x300000003;
          auVar30._12_4_ = 3;
          auVar30._16_4_ = 3;
          auVar30._20_4_ = 3;
          auVar30._24_4_ = 3;
          auVar30._28_4_ = 3;
          auVar82 = vpblendmd_avx512vl(auVar169,auVar30);
          local_740._0_4_ = (uint)(bVar59 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar59 & 1) * 2;
          bVar65 = (bool)(bVar59 >> 1 & 1);
          local_740._4_4_ = (uint)bVar65 * auVar82._4_4_ | (uint)!bVar65 * 2;
          bVar65 = (bool)(bVar59 >> 2 & 1);
          fStack_738 = (float)((uint)bVar65 * auVar82._8_4_ | (uint)!bVar65 * 2);
          bVar65 = (bool)(bVar59 >> 3 & 1);
          fStack_734 = (float)((uint)bVar65 * auVar82._12_4_ | (uint)!bVar65 * 2);
          bVar65 = (bool)(bVar59 >> 4 & 1);
          fStack_730 = (float)((uint)bVar65 * auVar82._16_4_ | (uint)!bVar65 * 2);
          bVar65 = (bool)(bVar59 >> 5 & 1);
          fStack_72c = (float)((uint)bVar65 * auVar82._20_4_ | (uint)!bVar65 * 2);
          bVar65 = (bool)(bVar59 >> 6 & 1);
          fStack_728 = (float)((uint)bVar65 * auVar82._24_4_ | (uint)!bVar65 * 2);
          fStack_724 = (float)((uint)(bVar59 >> 7) * auVar82._28_4_ | (uint)!(bool)(bVar59 >> 7) * 2
                              );
          auVar141._32_32_ = auVar81;
          auVar141._0_32_ = _local_740;
          uVar14 = vpcmpd_avx512vl(_local_740,local_6c0,2);
          bVar59 = (byte)uVar14 & bVar53;
          if (bVar59 != 0) {
            auVar71 = vminps_avx(local_8c0._0_16_,local_900._0_16_);
            auVar69 = vmaxps_avx(local_8c0._0_16_,local_900._0_16_);
            auVar78 = vminps_avx(local_8e0._0_16_,local_920._0_16_);
            auVar70 = vminps_avx(auVar71,auVar78);
            auVar71 = vmaxps_avx(local_8e0._0_16_,local_920._0_16_);
            auVar78 = vmaxps_avx(auVar69,auVar71);
            auVar69 = vandps_avx(auVar70,auVar220);
            auVar71 = vandps_avx(auVar78,auVar220);
            auVar69 = vmaxps_avx(auVar69,auVar71);
            auVar71 = vmovshdup_avx(auVar69);
            auVar71 = vmaxss_avx(auVar71,auVar69);
            auVar69 = vshufpd_avx(auVar69,auVar69,1);
            auVar69 = vmaxss_avx(auVar69,auVar71);
            fVar234 = auVar69._0_4_ * 1.9073486e-06;
            local_880 = vshufps_avx(auVar78,auVar78,0xff);
            _local_7e0 = _local_660;
            local_720 = (float)local_7a0._0_4_ + (float)local_660._0_4_;
            fStack_71c = (float)local_7a0._4_4_ + (float)local_660._4_4_;
            fStack_718 = fStack_798 + fStack_658;
            fStack_714 = fStack_794 + fStack_654;
            fStack_710 = fStack_790 + fStack_650;
            fStack_70c = fStack_78c + fStack_64c;
            fStack_708 = fStack_788 + fStack_648;
            fStack_704 = fStack_784 + fStack_644;
            do {
              auVar170._8_4_ = 0x7f800000;
              auVar170._0_8_ = 0x7f8000007f800000;
              auVar170._12_4_ = 0x7f800000;
              auVar170._16_4_ = 0x7f800000;
              auVar170._20_4_ = 0x7f800000;
              auVar170._24_4_ = 0x7f800000;
              auVar170._28_4_ = 0x7f800000;
              auVar81 = vblendmps_avx512vl(auVar170,_local_7e0);
              auVar131._0_4_ =
                   (uint)(bVar59 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar59 & 1) * 0x7f800000;
              bVar65 = (bool)(bVar59 >> 1 & 1);
              auVar131._4_4_ = (uint)bVar65 * auVar81._4_4_ | (uint)!bVar65 * 0x7f800000;
              bVar65 = (bool)(bVar59 >> 2 & 1);
              auVar131._8_4_ = (uint)bVar65 * auVar81._8_4_ | (uint)!bVar65 * 0x7f800000;
              bVar65 = (bool)(bVar59 >> 3 & 1);
              auVar131._12_4_ = (uint)bVar65 * auVar81._12_4_ | (uint)!bVar65 * 0x7f800000;
              bVar65 = (bool)(bVar59 >> 4 & 1);
              auVar131._16_4_ = (uint)bVar65 * auVar81._16_4_ | (uint)!bVar65 * 0x7f800000;
              bVar65 = (bool)(bVar59 >> 5 & 1);
              auVar131._20_4_ = (uint)bVar65 * auVar81._20_4_ | (uint)!bVar65 * 0x7f800000;
              auVar131._24_4_ =
                   (uint)(bVar59 >> 6) * auVar81._24_4_ | (uint)!(bool)(bVar59 >> 6) * 0x7f800000;
              auVar131._28_4_ = 0x7f800000;
              auVar141._0_32_ = auVar131;
              auVar81 = vshufps_avx(auVar131,auVar131,0xb1);
              auVar81 = vminps_avx(auVar131,auVar81);
              auVar82 = vshufpd_avx(auVar81,auVar81,5);
              auVar81 = vminps_avx(auVar81,auVar82);
              auVar82 = vpermpd_avx2(auVar81,0x4e);
              auVar81 = vminps_avx(auVar81,auVar82);
              uVar14 = vcmpps_avx512vl(auVar131,auVar81,0);
              bVar63 = (byte)uVar14 & bVar59;
              bVar58 = bVar59;
              if (bVar63 != 0) {
                bVar58 = bVar63;
              }
              iVar17 = 0;
              for (uVar68 = (uint)bVar58; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
                iVar17 = iVar17 + 1;
              }
              bVar58 = '\x01' << ((byte)iVar17 & 0x1f);
              uVar68 = *(uint *)(local_700 + (uint)(iVar17 << 2));
              uVar142 = *(uint *)(local_640 + (uint)(iVar17 << 2));
              fVar228 = auVar12._0_4_;
              if ((float)local_940._0_4_ < 0.0) {
                fVar228 = sqrtf((float)local_940._0_4_);
              }
              auVar244 = ZEXT464(uVar68);
              auVar241 = ZEXT464(uVar142);
              bVar63 = ~bVar58;
              lVar64 = 5;
              do {
                auVar81 = auVar141._32_32_;
                fVar229 = auVar241._0_4_;
                auVar156._4_4_ = fVar229;
                auVar156._0_4_ = fVar229;
                auVar156._8_4_ = fVar229;
                auVar156._12_4_ = fVar229;
                auVar69 = vfmadd132ps_fma(auVar156,ZEXT816(0) << 0x40,local_930);
                fVar238 = auVar244._0_4_;
                fVar207 = 1.0 - fVar238;
                auVar72 = SUB6416(ZEXT464(0x40400000),0);
                auVar236 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar243 = auVar244._0_16_;
                auVar78 = vfmadd213ss_fma(auVar72,auVar243,auVar236);
                auVar71 = vfmadd213ss_fma(auVar78,ZEXT416((uint)(fVar238 * fVar238)),
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar70 = vfmadd213ss_fma(auVar72,ZEXT416((uint)fVar207),auVar236);
                auVar70 = vfmadd213ss_fma(auVar70,ZEXT416((uint)(fVar207 * fVar207)),
                                          SUB6416(ZEXT464(0x40000000),0));
                fVar230 = fVar207 * fVar207 * -fVar238 * 0.5;
                fVar231 = auVar71._0_4_ * 0.5;
                fVar232 = auVar70._0_4_ * 0.5;
                fVar233 = fVar238 * fVar238 * -fVar207 * 0.5;
                auVar211._0_4_ = fVar233 * (float)local_920._0_4_;
                auVar211._4_4_ = fVar233 * (float)local_920._4_4_;
                auVar211._8_4_ = fVar233 * fStack_918;
                auVar211._12_4_ = fVar233 * fStack_914;
                auVar221._4_4_ = fVar232;
                auVar221._0_4_ = fVar232;
                auVar221._8_4_ = fVar232;
                auVar221._12_4_ = fVar232;
                auVar71 = vfmadd132ps_fma(auVar221,auVar211,local_8e0._0_16_);
                auVar199._4_4_ = fVar231;
                auVar199._0_4_ = fVar231;
                auVar199._8_4_ = fVar231;
                auVar199._12_4_ = fVar231;
                auVar71 = vfmadd132ps_fma(auVar199,auVar71,local_900._0_16_);
                auVar212._4_4_ = fVar230;
                auVar212._0_4_ = fVar230;
                auVar212._8_4_ = fVar230;
                auVar212._12_4_ = fVar230;
                auVar71 = vfmadd132ps_fma(auVar212,auVar71,local_8c0._0_16_);
                local_810 = vfmadd231ss_fma(auVar236,auVar243,ZEXT416(0x41100000));
                local_820 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar243,
                                            ZEXT416(0x40800000));
                local_830 = vfmadd213ss_fma(auVar72,auVar243,ZEXT416(0xbf800000));
                local_7c0._0_16_ = auVar71;
                auVar71 = vsubps_avx(auVar69,auVar71);
                auVar69 = vdpps_avx(auVar71,auVar71,0x7f);
                fVar230 = auVar69._0_4_;
                if (fVar230 < 0.0) {
                  auVar252._0_4_ = sqrtf(fVar230);
                  auVar252._4_60_ = extraout_var_00;
                  auVar78 = ZEXT416(auVar78._0_4_);
                  auVar70 = auVar252._0_16_;
                }
                else {
                  auVar70 = vsqrtss_avx(auVar69,auVar69);
                }
                auVar73 = vfnmadd231ss_fma(ZEXT416((uint)(fVar238 * (fVar207 + fVar207))),
                                           ZEXT416((uint)fVar207),ZEXT416((uint)fVar207));
                auVar78 = vfmadd213ss_fma(auVar78,ZEXT416((uint)(fVar238 + fVar238)),
                                          ZEXT416((uint)(fVar238 * fVar238 * 3.0)));
                auVar236 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar243,
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar207 * fVar207 * -3.0)),
                                          ZEXT416((uint)(fVar207 + fVar207)),auVar236);
                auVar236 = vfmadd213ss_fma(ZEXT416((uint)(fVar207 * -2.0)),auVar243,
                                           ZEXT416((uint)(fVar238 * fVar238)));
                fVar231 = auVar73._0_4_ * 0.5;
                fVar232 = auVar78._0_4_ * 0.5;
                fVar233 = auVar72._0_4_ * 0.5;
                fVar207 = auVar236._0_4_ * 0.5;
                auVar213._0_4_ = fVar207 * (float)local_920._0_4_;
                auVar213._4_4_ = fVar207 * (float)local_920._4_4_;
                auVar213._8_4_ = fVar207 * fStack_918;
                auVar213._12_4_ = fVar207 * fStack_914;
                auVar200._4_4_ = fVar233;
                auVar200._0_4_ = fVar233;
                auVar200._8_4_ = fVar233;
                auVar200._12_4_ = fVar233;
                auVar78 = vfmadd132ps_fma(auVar200,auVar213,local_8e0._0_16_);
                auVar180._4_4_ = fVar232;
                auVar180._0_4_ = fVar232;
                auVar180._8_4_ = fVar232;
                auVar180._12_4_ = fVar232;
                auVar78 = vfmadd132ps_fma(auVar180,auVar78,local_900._0_16_);
                auVar251._4_4_ = fVar231;
                auVar251._0_4_ = fVar231;
                auVar251._8_4_ = fVar231;
                auVar251._12_4_ = fVar231;
                auVar236 = vfmadd132ps_fma(auVar251,auVar78,local_8c0._0_16_);
                auVar78 = vdpps_avx(auVar236,auVar236,0x7f);
                auVar49._12_4_ = 0;
                auVar49._0_12_ = ZEXT812(0);
                fVar231 = auVar78._0_4_;
                auVar72 = vrsqrt14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar231));
                fVar232 = auVar72._0_4_;
                auVar73 = vrcp14ss_avx512f(auVar49 << 0x20,ZEXT416((uint)fVar231));
                auVar20._8_4_ = 0x80000000;
                auVar20._0_8_ = 0x8000000080000000;
                auVar20._12_4_ = 0x80000000;
                auVar74 = vxorps_avx512vl(auVar78,auVar20);
                auVar72 = vfnmadd213ss_fma(auVar73,auVar78,SUB6416(ZEXT464(0x40000000),0));
                uVar68 = auVar70._0_4_;
                if (fVar231 < auVar74._0_4_) {
                  fVar233 = sqrtf(fVar231);
                  auVar70 = ZEXT416(uVar68);
                }
                else {
                  auVar78 = vsqrtss_avx(auVar78,auVar78);
                  fVar233 = auVar78._0_4_;
                }
                fVar232 = fVar232 * 1.5 + fVar231 * -0.5 * fVar232 * fVar232 * fVar232;
                auVar157._0_4_ = auVar236._0_4_ * fVar232;
                auVar157._4_4_ = auVar236._4_4_ * fVar232;
                auVar157._8_4_ = auVar236._8_4_ * fVar232;
                auVar157._12_4_ = auVar236._12_4_ * fVar232;
                auVar78 = vdpps_avx(auVar71,auVar157,0x7f);
                fVar235 = auVar70._0_4_;
                auVar158._0_4_ = auVar78._0_4_ * auVar78._0_4_;
                auVar158._4_4_ = auVar78._4_4_ * auVar78._4_4_;
                auVar158._8_4_ = auVar78._8_4_ * auVar78._8_4_;
                auVar158._12_4_ = auVar78._12_4_ * auVar78._12_4_;
                auVar75 = vsubps_avx512vl(auVar69,auVar158);
                fVar207 = auVar75._0_4_;
                auVar181._4_12_ = ZEXT812(0) << 0x20;
                auVar181._0_4_ = fVar207;
                auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
                auVar76 = vmulss_avx512f(auVar74,ZEXT416(0x3fc00000));
                if (fVar207 < 0.0) {
                  local_860 = fVar232;
                  fStack_85c = fVar232;
                  fStack_858 = fVar232;
                  fStack_854 = fVar232;
                  local_850 = auVar74;
                  local_840 = auVar78;
                  fVar151 = sqrtf(fVar207);
                  auVar76 = ZEXT416(auVar76._0_4_);
                  auVar70 = ZEXT416(uVar68);
                  auVar78 = local_840;
                  auVar74 = local_850;
                  fVar232 = local_860;
                  fVar239 = fStack_85c;
                  fVar240 = fStack_858;
                  fVar242 = fStack_854;
                }
                else {
                  auVar75 = vsqrtss_avx(auVar75,auVar75);
                  fVar151 = auVar75._0_4_;
                  fVar239 = fVar232;
                  fVar240 = fVar232;
                  fVar242 = fVar232;
                }
                auVar252 = ZEXT1664(auVar236);
                auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar253 = ZEXT3264(auVar82);
                auVar137._32_32_ = auVar81;
                auVar137._0_32_ = auVar172._0_32_;
                auVar182._0_4_ = (float)local_830._0_4_ * (float)local_920._0_4_;
                auVar182._4_4_ = (float)local_830._0_4_ * (float)local_920._4_4_;
                auVar182._8_4_ = (float)local_830._0_4_ * fStack_918;
                auVar182._12_4_ = (float)local_830._0_4_ * fStack_914;
                auVar201._4_4_ = local_820._0_4_;
                auVar201._0_4_ = local_820._0_4_;
                auVar201._8_4_ = local_820._0_4_;
                auVar201._12_4_ = local_820._0_4_;
                auVar75 = vfmadd132ps_fma(auVar201,auVar182,local_8e0._0_16_);
                auVar183._4_4_ = local_810._0_4_;
                auVar183._0_4_ = local_810._0_4_;
                auVar183._8_4_ = local_810._0_4_;
                auVar183._12_4_ = local_810._0_4_;
                auVar75 = vfmadd132ps_fma(auVar183,auVar75,local_900._0_16_);
                auVar243 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar243,
                                           ZEXT416(0x40000000));
                auVar202._0_4_ = auVar243._0_4_;
                auVar202._4_4_ = auVar202._0_4_;
                auVar202._8_4_ = auVar202._0_4_;
                auVar202._12_4_ = auVar202._0_4_;
                auVar243 = vfmadd132ps_fma(auVar202,auVar75,local_8c0._0_16_);
                auVar184._0_4_ = auVar243._0_4_ * fVar231;
                auVar184._4_4_ = auVar243._4_4_ * fVar231;
                auVar184._8_4_ = auVar243._8_4_ * fVar231;
                auVar184._12_4_ = auVar243._12_4_ * fVar231;
                auVar243 = vdpps_avx(auVar236,auVar243,0x7f);
                fVar231 = auVar243._0_4_;
                auVar203._0_4_ = auVar236._0_4_ * fVar231;
                auVar203._4_4_ = auVar236._4_4_ * fVar231;
                auVar203._8_4_ = auVar236._8_4_ * fVar231;
                auVar203._12_4_ = auVar236._12_4_ * fVar231;
                auVar243 = vsubps_avx(auVar184,auVar203);
                local_bd0 = auVar73._0_4_;
                local_bd0 = auVar72._0_4_ * local_bd0;
                auVar73 = vmaxss_avx(ZEXT416((uint)fVar234),
                                     ZEXT416((uint)(fVar229 * fVar228 * 1.9073486e-06)));
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar141._16_48_ = auVar137._16_48_;
                auVar77 = vxorps_avx512vl(auVar236,auVar21);
                auVar204._0_4_ = fVar232 * auVar243._0_4_ * local_bd0;
                auVar204._4_4_ = fVar239 * auVar243._4_4_ * local_bd0;
                auVar204._8_4_ = fVar240 * auVar243._8_4_ * local_bd0;
                auVar204._12_4_ = fVar242 * auVar243._12_4_ * local_bd0;
                auVar249 = ZEXT1664(auVar157);
                auVar72 = vdpps_avx(auVar77,auVar157,0x7f);
                auVar243 = vfmadd213ss_fma(auVar70,ZEXT416((uint)fVar234),auVar73);
                auVar70 = vdpps_avx(auVar71,auVar204,0x7f);
                auVar75 = vfmadd213ss_fma(ZEXT416((uint)(fVar235 + 1.0)),
                                          ZEXT416((uint)(fVar234 / fVar233)),auVar243);
                fVar231 = auVar72._0_4_ + auVar70._0_4_;
                auVar70 = vdpps_avx(local_930,auVar157,0x7f);
                auVar72 = vdpps_avx(auVar71,auVar77,0x7f);
                fVar232 = auVar74._0_4_;
                auVar141._0_16_ =
                     vaddss_avx512f(auVar76,ZEXT416((uint)(fVar232 * fVar207 * -0.5 *
                                                          fVar232 * fVar232)));
                auVar243 = vdpps_avx(auVar71,local_930,0x7f);
                auVar74 = vfnmadd231ss_fma(auVar72,auVar78,ZEXT416((uint)fVar231));
                auVar76 = vfnmadd231ss_fma(auVar243,auVar78,auVar70);
                auVar72 = vpermilps_avx(local_7c0._0_16_,0xff);
                fVar151 = fVar151 - auVar72._0_4_;
                auVar72 = vshufps_avx(auVar236,auVar236,0xff);
                auVar243 = vfmsub213ss_fma(auVar74,auVar141._0_16_,auVar72);
                fVar232 = auVar76._0_4_ * auVar141._0_4_;
                auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar70._0_4_ * auVar243._0_4_)),
                                          ZEXT416((uint)fVar231),ZEXT416((uint)fVar232));
                fVar233 = auVar74._0_4_;
                fVar238 = fVar238 - (auVar78._0_4_ * (fVar232 / fVar233) -
                                    fVar151 * (auVar70._0_4_ / fVar233));
                auVar244 = ZEXT464((uint)fVar238);
                fVar229 = fVar229 - (fVar151 * (fVar231 / fVar233) -
                                    auVar78._0_4_ * (auVar243._0_4_ / fVar233));
                auVar241 = ZEXT464((uint)fVar229);
                auVar222._8_4_ = 0x7fffffff;
                auVar222._0_8_ = 0x7fffffff7fffffff;
                auVar222._12_4_ = 0x7fffffff;
                auVar78 = vandps_avx(auVar78,auVar222);
                bVar65 = true;
                if (auVar78._0_4_ < auVar75._0_4_) {
                  auVar70 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ + auVar73._0_4_)),local_880
                                            ,ZEXT416(0x36000000));
                  auVar78 = vandps_avx(ZEXT416((uint)fVar151),auVar222);
                  if (auVar78._0_4_ < auVar70._0_4_) {
                    fVar229 = fVar229 + (float)local_870._0_4_;
                    auVar241 = ZEXT464((uint)fVar229);
                    if ((((fVar149 <= fVar229) &&
                         (fVar231 = *(float *)(ray + k * 4 + 0x200), fVar229 <= fVar231)) &&
                        (0.0 <= fVar238)) && (fVar238 <= 1.0)) {
                      auVar139._16_48_ = auVar141._16_48_;
                      auVar139._0_16_ = ZEXT816(0) << 0x20;
                      auVar138._4_60_ = auVar139._4_60_;
                      auVar138._0_4_ = fVar230;
                      auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar138._0_16_);
                      fVar230 = auVar78._0_4_;
                      auVar141._0_16_ = vmulss_avx512f(auVar69,ZEXT416(0xbf000000));
                      pGVar3 = (context->scene->geometries).items[uVar60].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          bVar58 = true;
                        }
                        else {
                          fVar230 = fVar230 * 1.5 + auVar141._0_4_ * fVar230 * fVar230 * fVar230;
                          auVar185._0_4_ = auVar71._0_4_ * fVar230;
                          auVar185._4_4_ = auVar71._4_4_ * fVar230;
                          auVar185._8_4_ = auVar71._8_4_ * fVar230;
                          auVar185._12_4_ = auVar71._12_4_ * fVar230;
                          auVar70 = vfmadd213ps_fma(auVar72,auVar185,auVar236);
                          auVar69 = vshufps_avx(auVar185,auVar185,0xc9);
                          auVar71 = vshufps_avx(auVar236,auVar236,0xc9);
                          auVar186._0_4_ = auVar185._0_4_ * auVar71._0_4_;
                          auVar186._4_4_ = auVar185._4_4_ * auVar71._4_4_;
                          auVar186._8_4_ = auVar185._8_4_ * auVar71._8_4_;
                          auVar186._12_4_ = auVar185._12_4_ * auVar71._12_4_;
                          auVar78 = vfmsub231ps_fma(auVar186,auVar236,auVar69);
                          auVar69 = vshufps_avx(auVar78,auVar78,0xc9);
                          auVar71 = vshufps_avx(auVar70,auVar70,0xc9);
                          auVar78 = vshufps_avx(auVar78,auVar78,0xd2);
                          auVar159._0_4_ = auVar70._0_4_ * auVar78._0_4_;
                          auVar159._4_4_ = auVar70._4_4_ * auVar78._4_4_;
                          auVar159._8_4_ = auVar70._8_4_ * auVar78._8_4_;
                          auVar159._12_4_ = auVar70._12_4_ * auVar78._12_4_;
                          auVar69 = vfmsub231ps_fma(auVar159,auVar69,auVar71);
                          auVar71 = ZEXT416((uint)fVar238);
                          local_340 = vbroadcastss_avx512f(auVar71);
                          auVar218 = vbroadcastss_avx512f(ZEXT416(1));
                          auVar218 = vpermps_avx512f(auVar218,ZEXT1664(auVar69));
                          auVar140 = vbroadcastss_avx512f(ZEXT416(2));
                          local_3c0 = vpermps_avx512f(auVar140,ZEXT1664(auVar69));
                          local_380 = vbroadcastss_avx512f(auVar69);
                          local_400[0] = (RTCHitN)auVar218[0];
                          local_400[1] = (RTCHitN)auVar218[1];
                          local_400[2] = (RTCHitN)auVar218[2];
                          local_400[3] = (RTCHitN)auVar218[3];
                          local_400[4] = (RTCHitN)auVar218[4];
                          local_400[5] = (RTCHitN)auVar218[5];
                          local_400[6] = (RTCHitN)auVar218[6];
                          local_400[7] = (RTCHitN)auVar218[7];
                          local_400[8] = (RTCHitN)auVar218[8];
                          local_400[9] = (RTCHitN)auVar218[9];
                          local_400[10] = (RTCHitN)auVar218[10];
                          local_400[0xb] = (RTCHitN)auVar218[0xb];
                          local_400[0xc] = (RTCHitN)auVar218[0xc];
                          local_400[0xd] = (RTCHitN)auVar218[0xd];
                          local_400[0xe] = (RTCHitN)auVar218[0xe];
                          local_400[0xf] = (RTCHitN)auVar218[0xf];
                          local_400[0x10] = (RTCHitN)auVar218[0x10];
                          local_400[0x11] = (RTCHitN)auVar218[0x11];
                          local_400[0x12] = (RTCHitN)auVar218[0x12];
                          local_400[0x13] = (RTCHitN)auVar218[0x13];
                          local_400[0x14] = (RTCHitN)auVar218[0x14];
                          local_400[0x15] = (RTCHitN)auVar218[0x15];
                          local_400[0x16] = (RTCHitN)auVar218[0x16];
                          local_400[0x17] = (RTCHitN)auVar218[0x17];
                          local_400[0x18] = (RTCHitN)auVar218[0x18];
                          local_400[0x19] = (RTCHitN)auVar218[0x19];
                          local_400[0x1a] = (RTCHitN)auVar218[0x1a];
                          local_400[0x1b] = (RTCHitN)auVar218[0x1b];
                          local_400[0x1c] = (RTCHitN)auVar218[0x1c];
                          local_400[0x1d] = (RTCHitN)auVar218[0x1d];
                          local_400[0x1e] = (RTCHitN)auVar218[0x1e];
                          local_400[0x1f] = (RTCHitN)auVar218[0x1f];
                          local_400[0x20] = (RTCHitN)auVar218[0x20];
                          local_400[0x21] = (RTCHitN)auVar218[0x21];
                          local_400[0x22] = (RTCHitN)auVar218[0x22];
                          local_400[0x23] = (RTCHitN)auVar218[0x23];
                          local_400[0x24] = (RTCHitN)auVar218[0x24];
                          local_400[0x25] = (RTCHitN)auVar218[0x25];
                          local_400[0x26] = (RTCHitN)auVar218[0x26];
                          local_400[0x27] = (RTCHitN)auVar218[0x27];
                          local_400[0x28] = (RTCHitN)auVar218[0x28];
                          local_400[0x29] = (RTCHitN)auVar218[0x29];
                          local_400[0x2a] = (RTCHitN)auVar218[0x2a];
                          local_400[0x2b] = (RTCHitN)auVar218[0x2b];
                          local_400[0x2c] = (RTCHitN)auVar218[0x2c];
                          local_400[0x2d] = (RTCHitN)auVar218[0x2d];
                          local_400[0x2e] = (RTCHitN)auVar218[0x2e];
                          local_400[0x2f] = (RTCHitN)auVar218[0x2f];
                          local_400[0x30] = (RTCHitN)auVar218[0x30];
                          local_400[0x31] = (RTCHitN)auVar218[0x31];
                          local_400[0x32] = (RTCHitN)auVar218[0x32];
                          local_400[0x33] = (RTCHitN)auVar218[0x33];
                          local_400[0x34] = (RTCHitN)auVar218[0x34];
                          local_400[0x35] = (RTCHitN)auVar218[0x35];
                          local_400[0x36] = (RTCHitN)auVar218[0x36];
                          local_400[0x37] = (RTCHitN)auVar218[0x37];
                          local_400[0x38] = (RTCHitN)auVar218[0x38];
                          local_400[0x39] = (RTCHitN)auVar218[0x39];
                          local_400[0x3a] = (RTCHitN)auVar218[0x3a];
                          local_400[0x3b] = (RTCHitN)auVar218[0x3b];
                          local_400[0x3c] = (RTCHitN)auVar218[0x3c];
                          local_400[0x3d] = (RTCHitN)auVar218[0x3d];
                          local_400[0x3e] = (RTCHitN)auVar218[0x3e];
                          local_400[0x3f] = (RTCHitN)auVar218[0x3f];
                          local_300 = 0;
                          uStack_2f8 = 0;
                          uStack_2f0 = 0;
                          uStack_2e8 = 0;
                          uStack_2e0 = 0;
                          uStack_2d8 = 0;
                          uStack_2d0 = 0;
                          uStack_2c8 = 0;
                          local_2c0 = local_440._0_8_;
                          uStack_2b8 = local_440._8_8_;
                          uStack_2b0 = local_440._16_8_;
                          uStack_2a8 = local_440._24_8_;
                          uStack_2a0 = local_440._32_8_;
                          uStack_298 = local_440._40_8_;
                          uStack_290 = local_440._48_8_;
                          uStack_288 = local_440._56_8_;
                          auVar218 = vmovdqa64_avx512f(local_480);
                          local_280 = vmovdqa64_avx512f(auVar218);
                          vpcmpeqd_avx2(auVar218._0_32_,auVar218._0_32_);
                          local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                          local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                          *(float *)(ray + k * 4 + 0x200) = fVar229;
                          local_780 = local_4c0;
                          local_970.valid = (int *)local_780;
                          local_970.geometryUserPtr = pGVar3->userPtr;
                          local_970.context = context->user;
                          local_970.hit = local_400;
                          local_970.N = 0x10;
                          local_970.ray = (RTCRayN *)ray;
                          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar249 = ZEXT1664(auVar157);
                            auVar252 = ZEXT1664(auVar236);
                            (*pGVar3->occlusionFilterN)(&local_970);
                            auVar241 = ZEXT1664(ZEXT416((uint)fVar229));
                            auVar244 = ZEXT1664(auVar71);
                            auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar253 = ZEXT3264(auVar81);
                          }
                          auVar141 = vmovdqa64_avx512f(local_780);
                          uVar14 = vptestmd_avx512f(auVar141,auVar141);
                          if ((short)uVar14 == 0) {
                            bVar58 = false;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar249 = ZEXT1664(auVar249._0_16_);
                              auVar252 = ZEXT1664(auVar252._0_16_);
                              (*p_Var4)(&local_970);
                              auVar241 = ZEXT1664(ZEXT416((uint)fVar229));
                              auVar244 = ZEXT1664(auVar71);
                              auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar253 = ZEXT3264(auVar81);
                            }
                            auVar218 = vmovdqa64_avx512f(local_780);
                            uVar67 = vptestmd_avx512f(auVar218,auVar218);
                            auVar218 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                            bVar65 = (bool)((byte)uVar67 & 1);
                            auVar141._0_4_ =
                                 (uint)bVar65 * auVar218._0_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x200);
                            bVar65 = (bool)((byte)(uVar67 >> 1) & 1);
                            auVar141._4_4_ =
                                 (uint)bVar65 * auVar218._4_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x204);
                            bVar65 = (bool)((byte)(uVar67 >> 2) & 1);
                            auVar141._8_4_ =
                                 (uint)bVar65 * auVar218._8_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x208);
                            bVar65 = (bool)((byte)(uVar67 >> 3) & 1);
                            auVar141._12_4_ =
                                 (uint)bVar65 * auVar218._12_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x20c);
                            bVar65 = (bool)((byte)(uVar67 >> 4) & 1);
                            auVar141._16_4_ =
                                 (uint)bVar65 * auVar218._16_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x210);
                            bVar65 = (bool)((byte)(uVar67 >> 5) & 1);
                            auVar141._20_4_ =
                                 (uint)bVar65 * auVar218._20_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x214);
                            bVar65 = (bool)((byte)(uVar67 >> 6) & 1);
                            auVar141._24_4_ =
                                 (uint)bVar65 * auVar218._24_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x218);
                            bVar65 = (bool)((byte)(uVar67 >> 7) & 1);
                            auVar141._28_4_ =
                                 (uint)bVar65 * auVar218._28_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x21c);
                            bVar65 = (bool)((byte)(uVar67 >> 8) & 1);
                            auVar141._32_4_ =
                                 (uint)bVar65 * auVar218._32_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x220);
                            bVar65 = (bool)((byte)(uVar67 >> 9) & 1);
                            auVar141._36_4_ =
                                 (uint)bVar65 * auVar218._36_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x224);
                            bVar65 = (bool)((byte)(uVar67 >> 10) & 1);
                            auVar141._40_4_ =
                                 (uint)bVar65 * auVar218._40_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x228);
                            bVar65 = (bool)((byte)(uVar67 >> 0xb) & 1);
                            auVar141._44_4_ =
                                 (uint)bVar65 * auVar218._44_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x22c);
                            bVar65 = (bool)((byte)(uVar67 >> 0xc) & 1);
                            auVar141._48_4_ =
                                 (uint)bVar65 * auVar218._48_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x230);
                            bVar65 = (bool)((byte)(uVar67 >> 0xd) & 1);
                            auVar141._52_4_ =
                                 (uint)bVar65 * auVar218._52_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x234);
                            bVar65 = (bool)((byte)(uVar67 >> 0xe) & 1);
                            auVar141._56_4_ =
                                 (uint)bVar65 * auVar218._56_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x238);
                            bVar65 = SUB81(uVar67 >> 0xf,0);
                            auVar141._60_4_ =
                                 (uint)bVar65 * auVar218._60_4_ |
                                 (uint)!bVar65 * *(int *)(local_970.ray + 0x23c);
                            *(undefined1 (*) [64])(local_970.ray + 0x200) = auVar141;
                            bVar58 = (short)uVar67 != 0;
                          }
                          if ((bool)bVar58 == false) {
                            *(float *)(ray + k * 4 + 0x200) = fVar231;
                          }
                        }
                        bVar65 = false;
                        goto LAB_01dba968;
                      }
                    }
                    bVar65 = false;
                    bVar58 = 0;
                  }
                }
LAB_01dba968:
                if (!bVar65) goto LAB_01dbad6b;
                lVar64 = lVar64 + -1;
              } while (lVar64 != 0);
              bVar58 = 0;
LAB_01dbad6b:
              bVar62 = bVar62 | bVar58 & 1;
              auVar51._4_4_ = fStack_71c;
              auVar51._0_4_ = local_720;
              auVar51._8_4_ = fStack_718;
              auVar51._12_4_ = fStack_714;
              auVar51._16_4_ = fStack_710;
              auVar51._20_4_ = fStack_70c;
              auVar51._24_4_ = fStack_708;
              auVar51._28_4_ = fStack_704;
              uVar150 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar31._4_4_ = uVar150;
              auVar31._0_4_ = uVar150;
              auVar31._8_4_ = uVar150;
              auVar31._12_4_ = uVar150;
              auVar31._16_4_ = uVar150;
              auVar31._20_4_ = uVar150;
              auVar31._24_4_ = uVar150;
              auVar31._28_4_ = uVar150;
              uVar14 = vcmpps_avx512vl(auVar51,auVar31,2);
              bVar59 = bVar63 & bVar59 & (byte)uVar14;
            } while (bVar59 != 0);
          }
          uVar16 = vpcmpd_avx512vl(local_6c0,_local_740,1);
          uVar15 = vpcmpd_avx512vl(local_6c0,local_620,1);
          auVar188._0_4_ = (float)local_7a0._0_4_ + (float)local_500._0_4_;
          auVar188._4_4_ = (float)local_7a0._4_4_ + (float)local_500._4_4_;
          auVar188._8_4_ = fStack_798 + fStack_4f8;
          auVar188._12_4_ = fStack_794 + fStack_4f4;
          auVar188._16_4_ = fStack_790 + fStack_4f0;
          auVar188._20_4_ = fStack_78c + fStack_4ec;
          auVar188._24_4_ = fStack_788 + fStack_4e8;
          auVar188._28_4_ = fStack_784 + fStack_4e4;
          uVar150 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar206._4_4_ = uVar150;
          auVar206._0_4_ = uVar150;
          auVar206._8_4_ = uVar150;
          auVar206._12_4_ = uVar150;
          auVar206._16_4_ = uVar150;
          auVar206._20_4_ = uVar150;
          auVar206._24_4_ = uVar150;
          auVar206._28_4_ = uVar150;
          uVar14 = vcmpps_avx512vl(auVar188,auVar206,2);
          bVar56 = bVar56 & (byte)uVar15 & (byte)uVar14;
          auVar217._0_4_ = (float)local_7a0._0_4_ + local_660._0_4_;
          auVar217._4_4_ = (float)local_7a0._4_4_ + local_660._4_4_;
          auVar217._8_4_ = fStack_798 + local_660._8_4_;
          auVar217._12_4_ = fStack_794 + local_660._12_4_;
          auVar217._16_4_ = fStack_790 + local_660._16_4_;
          auVar217._20_4_ = fStack_78c + local_660._20_4_;
          auVar217._24_4_ = fStack_788 + local_660._24_4_;
          auVar217._28_4_ = fStack_784 + local_660._28_4_;
          uVar14 = vcmpps_avx512vl(auVar217,auVar206,2);
          bVar53 = bVar53 & (byte)uVar16 & (byte)uVar14 | bVar56;
          if (bVar53 != 0) {
            local_1a0[uVar55 * 0x60] = bVar53;
            auVar132._0_4_ =
                 (uint)(bVar56 & 1) * local_500._0_4_ |
                 (uint)!(bool)(bVar56 & 1) * (int)local_660._0_4_;
            bVar65 = (bool)(bVar56 >> 1 & 1);
            auVar132._4_4_ = (uint)bVar65 * local_500._4_4_ | (uint)!bVar65 * (int)local_660._4_4_;
            bVar65 = (bool)(bVar56 >> 2 & 1);
            auVar132._8_4_ = (uint)bVar65 * (int)fStack_4f8 | (uint)!bVar65 * (int)local_660._8_4_;
            bVar65 = (bool)(bVar56 >> 3 & 1);
            auVar132._12_4_ = (uint)bVar65 * (int)fStack_4f4 | (uint)!bVar65 * (int)local_660._12_4_
            ;
            bVar65 = (bool)(bVar56 >> 4 & 1);
            auVar132._16_4_ = (uint)bVar65 * (int)fStack_4f0 | (uint)!bVar65 * (int)local_660._16_4_
            ;
            bVar65 = (bool)(bVar56 >> 5 & 1);
            auVar132._20_4_ = (uint)bVar65 * (int)fStack_4ec | (uint)!bVar65 * (int)local_660._20_4_
            ;
            auVar132._24_4_ =
                 (uint)(bVar56 >> 6) * (int)fStack_4e8 |
                 (uint)!(bool)(bVar56 >> 6) * (int)local_660._24_4_;
            auVar132._28_4_ = local_660._28_4_;
            auVar141._0_32_ = auVar132;
            *(undefined1 (*) [32])(auStack_180 + uVar55 * 0x60) = auVar132;
            uVar14 = vmovlps_avx(local_890);
            *(undefined8 *)(local_160 + uVar55 * 0x18) = uVar14;
            local_158[uVar55 * 0x18] = iVar2 + 1;
            uVar55 = (ulong)((int)uVar55 + 1);
          }
        }
      }
      auVar218 = ZEXT3264(_local_800);
    }
    do {
      if ((int)uVar55 == 0) {
        if (bVar62 != 0) {
          return bVar66;
        }
        uVar150 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar33._4_4_ = uVar150;
        auVar33._0_4_ = uVar150;
        auVar33._8_4_ = uVar150;
        auVar33._12_4_ = uVar150;
        auVar33._16_4_ = uVar150;
        auVar33._20_4_ = uVar150;
        auVar33._24_4_ = uVar150;
        auVar33._28_4_ = uVar150;
        uVar14 = vcmpps_avx512vl(local_600,auVar33,2);
        uVar60 = (uint)uVar61 & (uint)uVar14;
        uVar61 = (ulong)uVar60;
        bVar66 = uVar60 != 0;
        if (!bVar66) {
          return bVar66;
        }
        goto LAB_01db84ba;
      }
      uVar67 = (ulong)((int)uVar55 - 1);
      lVar64 = uVar67 * 0x60;
      auVar81 = *(undefined1 (*) [32])(auStack_180 + lVar64);
      auVar189._0_4_ = auVar81._0_4_ + (float)local_7a0._0_4_;
      auVar189._4_4_ = auVar81._4_4_ + (float)local_7a0._4_4_;
      auVar189._8_4_ = auVar81._8_4_ + fStack_798;
      auVar189._12_4_ = auVar81._12_4_ + fStack_794;
      auVar189._16_4_ = auVar81._16_4_ + fStack_790;
      auVar189._20_4_ = auVar81._20_4_ + fStack_78c;
      auVar189._24_4_ = auVar81._24_4_ + fStack_788;
      auVar189._28_4_ = auVar81._28_4_ + fStack_784;
      uVar150 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar32._4_4_ = uVar150;
      auVar32._0_4_ = uVar150;
      auVar32._8_4_ = uVar150;
      auVar32._12_4_ = uVar150;
      auVar32._16_4_ = uVar150;
      auVar32._20_4_ = uVar150;
      auVar32._24_4_ = uVar150;
      auVar32._28_4_ = uVar150;
      uVar14 = vcmpps_avx512vl(auVar189,auVar32,2);
      uVar68 = (uint)uVar14 & (uint)local_1a0[lVar64];
      bVar53 = (byte)uVar68;
      if (uVar68 != 0) {
        auVar190._8_4_ = 0x7f800000;
        auVar190._0_8_ = 0x7f8000007f800000;
        auVar190._12_4_ = 0x7f800000;
        auVar190._16_4_ = 0x7f800000;
        auVar190._20_4_ = 0x7f800000;
        auVar190._24_4_ = 0x7f800000;
        auVar190._28_4_ = 0x7f800000;
        auVar82 = vblendmps_avx512vl(auVar190,auVar81);
        auVar133._0_4_ =
             (uint)(bVar53 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar53 & 1) * (int)auVar81._0_4_;
        bVar65 = (bool)((byte)(uVar68 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar65 * auVar82._4_4_ | (uint)!bVar65 * (int)auVar81._4_4_;
        bVar65 = (bool)((byte)(uVar68 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar65 * auVar82._8_4_ | (uint)!bVar65 * (int)auVar81._8_4_;
        bVar65 = (bool)((byte)(uVar68 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar65 * auVar82._12_4_ | (uint)!bVar65 * (int)auVar81._12_4_;
        bVar65 = (bool)((byte)(uVar68 >> 4) & 1);
        auVar133._16_4_ = (uint)bVar65 * auVar82._16_4_ | (uint)!bVar65 * (int)auVar81._16_4_;
        bVar65 = (bool)((byte)(uVar68 >> 5) & 1);
        auVar133._20_4_ = (uint)bVar65 * auVar82._20_4_ | (uint)!bVar65 * (int)auVar81._20_4_;
        bVar65 = (bool)((byte)(uVar68 >> 6) & 1);
        auVar133._24_4_ = (uint)bVar65 * auVar82._24_4_ | (uint)!bVar65 * (int)auVar81._24_4_;
        auVar133._28_4_ =
             (uVar68 >> 7) * auVar82._28_4_ | (uint)!SUB41(uVar68 >> 7,0) * (int)auVar81._28_4_;
        auVar141._0_32_ = auVar133;
        auVar81 = vshufps_avx(auVar133,auVar133,0xb1);
        auVar81 = vminps_avx(auVar133,auVar81);
        auVar82 = vshufpd_avx(auVar81,auVar81,5);
        auVar81 = vminps_avx(auVar81,auVar82);
        auVar82 = vpermpd_avx2(auVar81,0x4e);
        auVar81 = vminps_avx(auVar81,auVar82);
        uVar14 = vcmpps_avx512vl(auVar133,auVar81,0);
        bVar59 = (byte)uVar14 & bVar53;
        if (bVar59 != 0) {
          uVar68 = (uint)bVar59;
        }
        fVar234 = local_160[uVar67 * 0x18 + 1];
        uVar142 = 0;
        for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
          uVar142 = uVar142 + 1;
        }
        iVar2 = local_158[uVar67 * 0x18];
        bVar59 = ~('\x01' << ((byte)uVar142 & 0x1f)) & bVar53;
        local_1a0[lVar64] = bVar59;
        uVar57 = uVar67;
        if (bVar59 != 0) {
          uVar57 = uVar55;
        }
        fVar228 = local_160[uVar67 * 0x18];
        auVar191._4_4_ = fVar228;
        auVar191._0_4_ = fVar228;
        auVar191._8_4_ = fVar228;
        auVar191._12_4_ = fVar228;
        auVar191._16_4_ = fVar228;
        auVar191._20_4_ = fVar228;
        auVar191._24_4_ = fVar228;
        auVar191._28_4_ = fVar228;
        fVar234 = fVar234 - fVar228;
        auVar171._4_4_ = fVar234;
        auVar171._0_4_ = fVar234;
        auVar171._8_4_ = fVar234;
        auVar171._12_4_ = fVar234;
        auVar171._16_4_ = fVar234;
        auVar171._20_4_ = fVar234;
        auVar171._24_4_ = fVar234;
        auVar171._28_4_ = fVar234;
        auVar69 = vfmadd132ps_fma(auVar171,auVar191,_DAT_02020f20);
        auVar81 = ZEXT1632(auVar69);
        local_400[0] = (RTCHitN)auVar81[0];
        local_400[1] = (RTCHitN)auVar81[1];
        local_400[2] = (RTCHitN)auVar81[2];
        local_400[3] = (RTCHitN)auVar81[3];
        local_400[4] = (RTCHitN)auVar81[4];
        local_400[5] = (RTCHitN)auVar81[5];
        local_400[6] = (RTCHitN)auVar81[6];
        local_400[7] = (RTCHitN)auVar81[7];
        local_400[8] = (RTCHitN)auVar81[8];
        local_400[9] = (RTCHitN)auVar81[9];
        local_400[10] = (RTCHitN)auVar81[10];
        local_400[0xb] = (RTCHitN)auVar81[0xb];
        local_400[0xc] = (RTCHitN)auVar81[0xc];
        local_400[0xd] = (RTCHitN)auVar81[0xd];
        local_400[0xe] = (RTCHitN)auVar81[0xe];
        local_400[0xf] = (RTCHitN)auVar81[0xf];
        local_400[0x10] = (RTCHitN)auVar81[0x10];
        local_400[0x11] = (RTCHitN)auVar81[0x11];
        local_400[0x12] = (RTCHitN)auVar81[0x12];
        local_400[0x13] = (RTCHitN)auVar81[0x13];
        local_400[0x14] = (RTCHitN)auVar81[0x14];
        local_400[0x15] = (RTCHitN)auVar81[0x15];
        local_400[0x16] = (RTCHitN)auVar81[0x16];
        local_400[0x17] = (RTCHitN)auVar81[0x17];
        local_400[0x18] = (RTCHitN)auVar81[0x18];
        local_400[0x19] = (RTCHitN)auVar81[0x19];
        local_400[0x1a] = (RTCHitN)auVar81[0x1a];
        local_400[0x1b] = (RTCHitN)auVar81[0x1b];
        local_400[0x1c] = (RTCHitN)auVar81[0x1c];
        local_400[0x1d] = (RTCHitN)auVar81[0x1d];
        local_400[0x1e] = (RTCHitN)auVar81[0x1e];
        local_400[0x1f] = (RTCHitN)auVar81[0x1f];
        local_890._8_8_ = 0;
        local_890._0_8_ = *(ulong *)(local_400 + (ulong)uVar142 * 4);
        uVar67 = uVar57;
      }
      uVar55 = uVar67;
    } while (bVar53 == 0);
    auVar81 = auVar141._32_32_;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }